

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx2::CurveNiIntersectorK<4,4>::
     intersect_hn<embree::avx2::OrientedCurve1IntersectorK<embree::HermiteCurveT,4>,embree::avx2::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  Primitive PVar2;
  uint uVar3;
  Geometry *pGVar4;
  long lVar5;
  __int_type_conflict _Var6;
  RTCFilterFunctionN p_Var7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  int iVar19;
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  bool bVar42;
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  uint uVar52;
  uint uVar53;
  uint uVar54;
  uint uVar55;
  ulong uVar56;
  long lVar58;
  byte bVar59;
  uint uVar60;
  ulong uVar61;
  float fVar62;
  vint4 bi_2;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined4 uVar63;
  undefined1 auVar69 [16];
  float fVar64;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [32];
  undefined8 extraout_XMM1_Qa;
  float fVar95;
  vint4 bi_1;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  float fVar96;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 extraout_var [56];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  vint4 ai_2;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  vint4 ai;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  float fVar133;
  float fVar147;
  float fVar148;
  vint4 bi;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  float fVar149;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  float fVar150;
  float fVar151;
  float fVar152;
  undefined1 auVar146 [32];
  float fVar153;
  undefined8 uVar154;
  float fVar172;
  vfloat4 b0;
  float fVar170;
  float fVar174;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  float fVar171;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  float fVar176;
  float fVar177;
  float fVar178;
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  float fVar173;
  float fVar175;
  undefined1 auVar169 [32];
  vfloat4 a0_3;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [32];
  vint4 ai_1;
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [32];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [32];
  float fVar231;
  __m128 a;
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  float fVar232;
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  float fVar233;
  float fVar234;
  float fVar235;
  vfloat4 a0_1;
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [32];
  float fVar244;
  float fVar254;
  float fVar255;
  float fVar256;
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  vfloat4 a0;
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar277 [16];
  undefined1 auVar281 [32];
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_668 [8];
  float fStack_660;
  float fStack_65c;
  undefined1 local_628 [8];
  float fStack_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float local_608;
  float fStack_604;
  undefined1 local_5a8 [8];
  undefined8 uStack_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 *local_530;
  RTCFilterFunctionNArguments local_528;
  undefined1 local_4f8 [8];
  float fStack_4f0;
  float fStack_4ec;
  undefined1 local_4e8 [8];
  float fStack_4e0;
  float fStack_4dc;
  undefined1 local_4d8 [16];
  undefined1 local_4c8 [16];
  undefined1 local_4b8 [16];
  undefined1 local_4a8 [8];
  float fStack_4a0;
  float fStack_49c;
  undefined1 local_498 [16];
  undefined1 local_488 [16];
  undefined1 local_478 [16];
  undefined1 local_468 [8];
  float fStack_460;
  float fStack_45c;
  undefined1 local_458 [8];
  float fStack_450;
  float fStack_44c;
  undefined1 local_448 [8];
  float fStack_440;
  float fStack_43c;
  undefined1 local_438 [8];
  float fStack_430;
  float fStack_42c;
  undefined1 local_428 [8];
  float fStack_420;
  float fStack_41c;
  undefined1 local_418 [16];
  undefined1 local_408 [16];
  undefined1 local_3f8 [16];
  undefined1 local_3e8 [16];
  undefined1 local_3d8 [32];
  uint auStack_3b8 [4];
  uint local_3a8;
  uint uStack_3a4;
  uint uStack_3a0;
  uint uStack_39c;
  uint local_398;
  uint uStack_394;
  uint uStack_390;
  uint uStack_38c;
  undefined1 local_388 [16];
  undefined1 local_378 [8];
  float fStack_370;
  float fStack_36c;
  undefined1 local_368 [16];
  undefined1 local_358 [16];
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  undefined1 local_328 [16];
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [32];
  uint uStack_268;
  float afStack_264 [7];
  RTCHitN local_248 [16];
  undefined1 local_238 [16];
  undefined4 local_228;
  undefined4 uStack_224;
  undefined4 uStack_220;
  undefined4 uStack_21c;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [16];
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined1 local_1e8 [16];
  uint local_1d8;
  uint uStack_1d4;
  uint uStack_1d0;
  uint uStack_1cc;
  uint uStack_1c8;
  uint uStack_1c4;
  uint uStack_1c0;
  uint uStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  undefined1 local_178 [32];
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  undefined1 local_138 [32];
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar57;
  undefined1 auVar94 [64];
  undefined1 auVar115 [32];
  
  PVar2 = prim[1];
  uVar61 = (ulong)(byte)PVar2;
  fVar62 = *(float *)(prim + uVar61 * 0x19 + 0x12);
  auVar8 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x10
                        );
  auVar8 = vinsertps_avx(auVar8,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar70 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar70 = vinsertps_avx(auVar70,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar8 = vsubps_avx(auVar8,*(undefined1 (*) [16])(prim + uVar61 * 0x19 + 6));
  auVar123._0_4_ = fVar62 * auVar8._0_4_;
  auVar123._4_4_ = fVar62 * auVar8._4_4_;
  auVar123._8_4_ = fVar62 * auVar8._8_4_;
  auVar123._12_4_ = fVar62 * auVar8._12_4_;
  auVar134._0_4_ = fVar62 * auVar70._0_4_;
  auVar134._4_4_ = fVar62 * auVar70._4_4_;
  auVar134._8_4_ = fVar62 * auVar70._8_4_;
  auVar134._12_4_ = fVar62 * auVar70._12_4_;
  auVar8 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 * 4 + 6)));
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar70 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 * 5 + 6)));
  auVar70 = vcvtdq2ps_avx(auVar70);
  auVar272 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 * 6 + 6)));
  auVar272 = vcvtdq2ps_avx(auVar272);
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar61 * 0xb + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar10 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar2 * 0xc) + 6)));
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar11 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar2 * 0xc + uVar61 + 6)));
  auVar11 = vcvtdq2ps_avx(auVar11);
  uVar56 = (ulong)(uint)((int)(uVar61 * 9) * 2);
  auVar66 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar56 + 6)));
  auVar66 = vcvtdq2ps_avx(auVar66);
  auVar65 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar56 + uVar61 + 6)));
  auVar65 = vcvtdq2ps_avx(auVar65);
  uVar56 = (ulong)(uint)((int)(uVar61 * 5) << 2);
  auVar97 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar56 + 6)));
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar268._4_4_ = auVar134._0_4_;
  auVar268._0_4_ = auVar134._0_4_;
  auVar268._8_4_ = auVar134._0_4_;
  auVar268._12_4_ = auVar134._0_4_;
  auVar74 = vshufps_avx(auVar134,auVar134,0x55);
  auVar200 = vshufps_avx(auVar134,auVar134,0xaa);
  fVar62 = auVar200._0_4_;
  auVar236._0_4_ = fVar62 * auVar272._0_4_;
  fVar133 = auVar200._4_4_;
  auVar236._4_4_ = fVar133 * auVar272._4_4_;
  fVar147 = auVar200._8_4_;
  auVar236._8_4_ = fVar147 * auVar272._8_4_;
  fVar148 = auVar200._12_4_;
  auVar236._12_4_ = fVar148 * auVar272._12_4_;
  auVar220._0_4_ = auVar11._0_4_ * fVar62;
  auVar220._4_4_ = auVar11._4_4_ * fVar133;
  auVar220._8_4_ = auVar11._8_4_ * fVar147;
  auVar220._12_4_ = auVar11._12_4_ * fVar148;
  auVar193._0_4_ = auVar97._0_4_ * fVar62;
  auVar193._4_4_ = auVar97._4_4_ * fVar133;
  auVar193._8_4_ = auVar97._8_4_ * fVar147;
  auVar193._12_4_ = auVar97._12_4_ * fVar148;
  auVar200 = vfmadd231ps_fma(auVar236,auVar74,auVar70);
  auVar75 = vfmadd231ps_fma(auVar220,auVar74,auVar10);
  auVar74 = vfmadd231ps_fma(auVar193,auVar65,auVar74);
  auVar108 = vfmadd231ps_fma(auVar200,auVar268,auVar8);
  auVar75 = vfmadd231ps_fma(auVar75,auVar268,auVar9);
  auVar119 = vfmadd231ps_fma(auVar74,auVar66,auVar268);
  auVar269._4_4_ = auVar123._0_4_;
  auVar269._0_4_ = auVar123._0_4_;
  auVar269._8_4_ = auVar123._0_4_;
  auVar269._12_4_ = auVar123._0_4_;
  auVar74 = vshufps_avx(auVar123,auVar123,0x55);
  auVar200 = vshufps_avx(auVar123,auVar123,0xaa);
  fVar62 = auVar200._0_4_;
  auVar135._0_4_ = fVar62 * auVar272._0_4_;
  fVar133 = auVar200._4_4_;
  auVar135._4_4_ = fVar133 * auVar272._4_4_;
  fVar147 = auVar200._8_4_;
  auVar135._8_4_ = fVar147 * auVar272._8_4_;
  fVar148 = auVar200._12_4_;
  auVar135._12_4_ = fVar148 * auVar272._12_4_;
  auVar73._0_4_ = auVar11._0_4_ * fVar62;
  auVar73._4_4_ = auVar11._4_4_ * fVar133;
  auVar73._8_4_ = auVar11._8_4_ * fVar147;
  auVar73._12_4_ = auVar11._12_4_ * fVar148;
  auVar200._0_4_ = auVar97._0_4_ * fVar62;
  auVar200._4_4_ = auVar97._4_4_ * fVar133;
  auVar200._8_4_ = auVar97._8_4_ * fVar147;
  auVar200._12_4_ = auVar97._12_4_ * fVar148;
  auVar70 = vfmadd231ps_fma(auVar135,auVar74,auVar70);
  auVar272 = vfmadd231ps_fma(auVar73,auVar74,auVar10);
  auVar10 = vfmadd231ps_fma(auVar200,auVar74,auVar65);
  auVar11 = vfmadd231ps_fma(auVar70,auVar269,auVar8);
  auVar65 = vfmadd231ps_fma(auVar272,auVar269,auVar9);
  auVar97 = vfmadd231ps_fma(auVar10,auVar269,auVar66);
  auVar277._8_4_ = 0x7fffffff;
  auVar277._0_8_ = 0x7fffffff7fffffff;
  auVar277._12_4_ = 0x7fffffff;
  auVar8 = vandps_avx(auVar108,auVar277);
  auVar118._8_4_ = 0x219392ef;
  auVar118._0_8_ = 0x219392ef219392ef;
  auVar118._12_4_ = 0x219392ef;
  auVar8 = vcmpps_avx(auVar8,auVar118,1);
  auVar70 = vblendvps_avx(auVar108,auVar118,auVar8);
  auVar8 = vandps_avx(auVar75,auVar277);
  auVar8 = vcmpps_avx(auVar8,auVar118,1);
  auVar272 = vblendvps_avx(auVar75,auVar118,auVar8);
  auVar8 = vandps_avx(auVar119,auVar277);
  auVar8 = vcmpps_avx(auVar8,auVar118,1);
  auVar8 = vblendvps_avx(auVar119,auVar118,auVar8);
  auVar9 = vrcpps_avx(auVar70);
  auVar179._8_4_ = 0x3f800000;
  auVar179._0_8_ = &DAT_3f8000003f800000;
  auVar179._12_4_ = 0x3f800000;
  auVar70 = vfnmadd213ps_fma(auVar70,auVar9,auVar179);
  auVar9 = vfmadd132ps_fma(auVar70,auVar9,auVar9);
  auVar70 = vrcpps_avx(auVar272);
  auVar272 = vfnmadd213ps_fma(auVar272,auVar70,auVar179);
  auVar10 = vfmadd132ps_fma(auVar272,auVar70,auVar70);
  auVar70 = vrcpps_avx(auVar8);
  auVar8 = vfnmadd213ps_fma(auVar8,auVar70,auVar179);
  auVar66 = vfmadd132ps_fma(auVar8,auVar70,auVar70);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar61 * 7 + 6);
  auVar8 = vpmovsxwd_avx(auVar8);
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar8 = vsubps_avx(auVar8,auVar11);
  auVar119._0_4_ = auVar9._0_4_ * auVar8._0_4_;
  auVar119._4_4_ = auVar9._4_4_ * auVar8._4_4_;
  auVar119._8_4_ = auVar9._8_4_ * auVar8._8_4_;
  auVar119._12_4_ = auVar9._12_4_ * auVar8._12_4_;
  auVar70._8_8_ = 0;
  auVar70._0_8_ = *(ulong *)(prim + uVar61 * 9 + 6);
  auVar8 = vpmovsxwd_avx(auVar70);
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar8 = vsubps_avx(auVar8,auVar11);
  auVar136._0_4_ = auVar9._0_4_ * auVar8._0_4_;
  auVar136._4_4_ = auVar9._4_4_ * auVar8._4_4_;
  auVar136._8_4_ = auVar9._8_4_ * auVar8._8_4_;
  auVar136._12_4_ = auVar9._12_4_ * auVar8._12_4_;
  auVar75._1_3_ = 0;
  auVar75[0] = PVar2;
  auVar272._8_8_ = 0;
  auVar272._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar2 * 0x10 + 6);
  auVar70 = vpmovsxwd_avx(auVar272);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar2 * 0x10 + uVar61 * -2 + 6);
  auVar8 = vpmovsxwd_avx(auVar9);
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar8 = vsubps_avx(auVar8,auVar65);
  auVar194._0_4_ = auVar8._0_4_ * auVar10._0_4_;
  auVar194._4_4_ = auVar8._4_4_ * auVar10._4_4_;
  auVar194._8_4_ = auVar8._8_4_ * auVar10._8_4_;
  auVar194._12_4_ = auVar8._12_4_ * auVar10._12_4_;
  auVar8 = vcvtdq2ps_avx(auVar70);
  auVar8 = vsubps_avx(auVar8,auVar65);
  auVar74._0_4_ = auVar10._0_4_ * auVar8._0_4_;
  auVar74._4_4_ = auVar10._4_4_ * auVar8._4_4_;
  auVar74._8_4_ = auVar10._8_4_ * auVar8._8_4_;
  auVar74._12_4_ = auVar10._12_4_ * auVar8._12_4_;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar56 + uVar61 + 6);
  auVar8 = vpmovsxwd_avx(auVar10);
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar8 = vsubps_avx(auVar8,auVar97);
  auVar108._0_4_ = auVar66._0_4_ * auVar8._0_4_;
  auVar108._4_4_ = auVar66._4_4_ * auVar8._4_4_;
  auVar108._8_4_ = auVar66._8_4_ * auVar8._8_4_;
  auVar108._12_4_ = auVar66._12_4_ * auVar8._12_4_;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar61 * 0x17 + 6);
  auVar8 = vpmovsxwd_avx(auVar11);
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar8 = vsubps_avx(auVar8,auVar97);
  auVar65._0_4_ = auVar66._0_4_ * auVar8._0_4_;
  auVar65._4_4_ = auVar66._4_4_ * auVar8._4_4_;
  auVar65._8_4_ = auVar66._8_4_ * auVar8._8_4_;
  auVar65._12_4_ = auVar66._12_4_ * auVar8._12_4_;
  auVar8 = vpminsd_avx(auVar119,auVar136);
  auVar70 = vpminsd_avx(auVar194,auVar74);
  auVar8 = vmaxps_avx(auVar8,auVar70);
  auVar70 = vpminsd_avx(auVar108,auVar65);
  uVar63 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar209._4_4_ = uVar63;
  auVar209._0_4_ = uVar63;
  auVar209._8_4_ = uVar63;
  auVar209._12_4_ = uVar63;
  auVar70 = vmaxps_avx(auVar70,auVar209);
  auVar8 = vmaxps_avx(auVar8,auVar70);
  local_388._0_4_ = auVar8._0_4_ * 0.99999964;
  local_388._4_4_ = auVar8._4_4_ * 0.99999964;
  local_388._8_4_ = auVar8._8_4_ * 0.99999964;
  local_388._12_4_ = auVar8._12_4_ * 0.99999964;
  auVar8 = vpmaxsd_avx(auVar119,auVar136);
  auVar70 = vpmaxsd_avx(auVar194,auVar74);
  auVar8 = vminps_avx(auVar8,auVar70);
  auVar70 = vpmaxsd_avx(auVar108,auVar65);
  uVar63 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar97._4_4_ = uVar63;
  auVar97._0_4_ = uVar63;
  auVar97._8_4_ = uVar63;
  auVar97._12_4_ = uVar63;
  auVar70 = vminps_avx(auVar70,auVar97);
  auVar8 = vminps_avx(auVar8,auVar70);
  auVar66._0_4_ = auVar8._0_4_ * 1.0000004;
  auVar66._4_4_ = auVar8._4_4_ * 1.0000004;
  auVar66._8_4_ = auVar8._8_4_ * 1.0000004;
  auVar66._12_4_ = auVar8._12_4_ * 1.0000004;
  auVar75[4] = PVar2;
  auVar75._5_3_ = 0;
  auVar75[8] = PVar2;
  auVar75._9_3_ = 0;
  auVar75[0xc] = PVar2;
  auVar75._13_3_ = 0;
  auVar70 = vpcmpgtd_avx(auVar75,_DAT_01ff0cf0);
  auVar8 = vcmpps_avx(local_388,auVar66,2);
  auVar8 = vandps_avx(auVar8,auVar70);
  uVar52 = vmovmskps_avx(auVar8);
  if (uVar52 == 0) {
    return;
  }
  uVar52 = uVar52 & 0xff;
  auVar72._16_16_ = mm_lookupmask_ps._240_16_;
  auVar72._0_16_ = mm_lookupmask_ps._240_16_;
  local_288 = vblendps_avx(auVar72,ZEXT832(0) << 0x20,0x80);
  local_530 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
LAB_016a9c6b:
  lVar58 = 0;
  for (uVar56 = (ulong)uVar52; (uVar56 & 1) == 0; uVar56 = uVar56 >> 1 | 0x8000000000000000) {
    lVar58 = lVar58 + 1;
  }
  uVar55 = *(uint *)(prim + 2);
  uVar3 = *(uint *)(prim + lVar58 * 4 + 6);
  pGVar4 = (context->scene->geometries).items[uVar55].ptr;
  lVar5 = *(long *)&pGVar4[1].time_range.upper;
  uVar56 = (ulong)*(uint *)(*(long *)&pGVar4->field_0x58 +
                           (ulong)uVar3 *
                           pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  auVar8 = *(undefined1 (*) [16])(lVar5 + (long)pGVar4[1].intersectionFilterN * uVar56);
  lVar58 = uVar56 + 1;
  auVar70 = *(undefined1 (*) [16])(lVar5 + (long)pGVar4[1].intersectionFilterN * lVar58);
  _Var6 = pGVar4[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar272 = *(undefined1 (*) [16])(_Var6 + (long)pGVar4[2].userPtr * uVar56);
  auVar9 = *(undefined1 (*) [16])(_Var6 + (long)pGVar4[2].userPtr * lVar58);
  auVar10 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar10 = vinsertps_avx(auVar10,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  auVar76._8_4_ = 0x3eaaaaab;
  auVar76._0_8_ = 0x3eaaaaab3eaaaaab;
  auVar76._12_4_ = 0x3eaaaaab;
  auVar11 = vfmadd132ps_fma(*(undefined1 (*) [16])
                             (pGVar4[2].intersectionFilterN +
                             (long)pGVar4[2].pointQueryFunc * uVar56),auVar8,auVar76);
  auVar74 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                              (pGVar4[2].intersectionFilterN +
                              (long)pGVar4[2].pointQueryFunc * lVar58),auVar70,auVar76);
  auVar66 = vfmadd132ps_fma(*(undefined1 (*) [16])
                             ((long)pGVar4[3].userPtr +
                             uVar56 * *(long *)&pGVar4[3].fnumTimeSegments),auVar272,auVar76);
  auVar200 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                               ((long)pGVar4[3].userPtr +
                               *(long *)&pGVar4[3].fnumTimeSegments * lVar58),auVar9,auVar76);
  auVar67._12_4_ = 0;
  auVar67._0_12_ = ZEXT812(0);
  auVar67 = auVar67 << 0x20;
  auVar77._0_4_ = auVar70._0_4_ * 0.0;
  auVar77._4_4_ = auVar70._4_4_ * 0.0;
  auVar77._8_4_ = auVar70._8_4_ * 0.0;
  auVar77._12_4_ = auVar70._12_4_ * 0.0;
  auVar97 = vfmadd231ps_fma(auVar77,auVar74,auVar67);
  auVar65 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar11,auVar97);
  local_668._0_4_ = auVar8._0_4_ + auVar65._0_4_;
  local_668._4_4_ = auVar8._4_4_ + auVar65._4_4_;
  fStack_660 = auVar8._8_4_ + auVar65._8_4_;
  fStack_65c = auVar8._12_4_ + auVar65._12_4_;
  auVar270._8_4_ = 0x40400000;
  auVar270._0_8_ = 0x4040000040400000;
  auVar270._12_4_ = 0x40400000;
  auVar65 = vfmadd231ps_fma(auVar97,auVar11,auVar270);
  auVar75 = vfnmadd231ps_fma(auVar65,auVar8,auVar270);
  auVar237._0_4_ = auVar9._0_4_ * 0.0;
  auVar237._4_4_ = auVar9._4_4_ * 0.0;
  auVar237._8_4_ = auVar9._8_4_ * 0.0;
  auVar237._12_4_ = auVar9._12_4_ * 0.0;
  auVar97 = vfmadd231ps_fma(auVar237,auVar200,auVar67);
  auVar65 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar66,auVar97);
  auVar257._0_4_ = auVar272._0_4_ + auVar65._0_4_;
  auVar257._4_4_ = auVar272._4_4_ + auVar65._4_4_;
  auVar257._8_4_ = auVar272._8_4_ + auVar65._8_4_;
  auVar257._12_4_ = auVar272._12_4_ + auVar65._12_4_;
  auVar65 = vfmadd231ps_fma(auVar97,auVar66,auVar270);
  auVar97 = vfnmadd231ps_fma(auVar65,auVar272,auVar270);
  auVar65 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar74,auVar70);
  auVar65 = vfmadd231ps_fma(auVar65,auVar11,auVar67);
  auVar65 = vfmadd231ps_fma(auVar65,auVar8,auVar67);
  auVar120._0_4_ = auVar70._0_4_ * 3.0;
  auVar120._4_4_ = auVar70._4_4_ * 3.0;
  auVar120._8_4_ = auVar70._8_4_ * 3.0;
  auVar120._12_4_ = auVar70._12_4_ * 3.0;
  auVar70 = vfnmadd231ps_fma(auVar120,auVar270,auVar74);
  auVar70 = vfmadd231ps_fma(auVar70,auVar67,auVar11);
  auVar74 = vfnmadd231ps_fma(auVar70,auVar67,auVar8);
  auVar8 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar200,auVar9);
  auVar8 = vfmadd231ps_fma(auVar8,auVar66,auVar67);
  auVar11 = vfmadd231ps_fma(auVar8,auVar272,auVar67);
  auVar180._0_4_ = auVar9._0_4_ * 3.0;
  auVar180._4_4_ = auVar9._4_4_ * 3.0;
  auVar180._8_4_ = auVar9._8_4_ * 3.0;
  auVar180._12_4_ = auVar9._12_4_ * 3.0;
  auVar8 = vfnmadd231ps_fma(auVar180,auVar270,auVar200);
  auVar8 = vfmadd231ps_fma(auVar8,auVar67,auVar66);
  auVar66 = vfnmadd231ps_fma(auVar8,auVar67,auVar272);
  auVar8 = vshufps_avx(auVar75,auVar75,0xc9);
  auVar70 = vshufps_avx(auVar257,auVar257,0xc9);
  fVar62 = auVar75._0_4_;
  auVar195._0_4_ = auVar70._0_4_ * fVar62;
  fVar147 = auVar75._4_4_;
  auVar195._4_4_ = auVar70._4_4_ * fVar147;
  fVar149 = auVar75._8_4_;
  auVar195._8_4_ = auVar70._8_4_ * fVar149;
  fVar96 = auVar75._12_4_;
  auVar195._12_4_ = auVar70._12_4_ * fVar96;
  auVar70 = vfmsub231ps_fma(auVar195,auVar8,auVar257);
  auVar272 = vshufps_avx(auVar70,auVar70,0xc9);
  auVar70 = vshufps_avx(auVar97,auVar97,0xc9);
  auVar210._0_4_ = auVar70._0_4_ * fVar62;
  auVar210._4_4_ = auVar70._4_4_ * fVar147;
  auVar210._8_4_ = auVar70._8_4_ * fVar149;
  auVar210._12_4_ = auVar70._12_4_ * fVar96;
  auVar8 = vfmsub231ps_fma(auVar210,auVar8,auVar97);
  auVar9 = vshufps_avx(auVar8,auVar8,0xc9);
  auVar8 = vshufps_avx(auVar74,auVar74,0xc9);
  auVar70 = vshufps_avx(auVar11,auVar11,0xc9);
  fVar133 = auVar74._0_4_;
  auVar221._0_4_ = auVar70._0_4_ * fVar133;
  fVar148 = auVar74._4_4_;
  auVar221._4_4_ = auVar70._4_4_ * fVar148;
  fVar95 = auVar74._8_4_;
  auVar221._8_4_ = auVar70._8_4_ * fVar95;
  fVar64 = auVar74._12_4_;
  auVar221._12_4_ = auVar70._12_4_ * fVar64;
  auVar70 = vfmsub231ps_fma(auVar221,auVar8,auVar11);
  auVar11 = vshufps_avx(auVar70,auVar70,0xc9);
  auVar70 = vshufps_avx(auVar66,auVar66,0xc9);
  auVar222._0_4_ = auVar70._0_4_ * fVar133;
  auVar222._4_4_ = auVar70._4_4_ * fVar148;
  auVar222._8_4_ = auVar70._8_4_ * fVar95;
  auVar222._12_4_ = auVar70._12_4_ * fVar64;
  auVar8 = vfmsub231ps_fma(auVar222,auVar8,auVar66);
  auVar66 = vshufps_avx(auVar8,auVar8,0xc9);
  auVar8 = vdpps_avx(auVar272,auVar272,0x7f);
  fVar150 = auVar8._0_4_;
  auVar97 = ZEXT416((uint)fVar150);
  auVar70 = vrsqrtss_avx(auVar97,auVar97);
  fVar171 = auVar70._0_4_;
  fVar151 = fVar171 * 1.5 - fVar150 * 0.5 * fVar171 * fVar171 * fVar171;
  auVar70 = vdpps_avx(auVar272,auVar9,0x7f);
  fVar153 = auVar272._0_4_ * fVar151;
  fVar170 = auVar272._4_4_ * fVar151;
  fVar172 = auVar272._8_4_ * fVar151;
  fVar174 = auVar272._12_4_ * fVar151;
  auVar211._0_4_ = fVar150 * auVar9._0_4_;
  auVar211._4_4_ = fVar150 * auVar9._4_4_;
  auVar211._8_4_ = fVar150 * auVar9._8_4_;
  auVar211._12_4_ = fVar150 * auVar9._12_4_;
  fVar171 = auVar70._0_4_;
  auVar196._0_4_ = fVar171 * auVar272._0_4_;
  auVar196._4_4_ = fVar171 * auVar272._4_4_;
  auVar196._8_4_ = fVar171 * auVar272._8_4_;
  auVar196._12_4_ = fVar171 * auVar272._12_4_;
  auVar272 = vsubps_avx(auVar211,auVar196);
  auVar70 = vrcpss_avx(auVar97,auVar97);
  auVar8 = vfnmadd213ss_fma(auVar8,auVar70,SUB6416(ZEXT464(0x40000000),0));
  fVar171 = auVar70._0_4_ * auVar8._0_4_;
  auVar8 = vdpps_avx(auVar11,auVar11,0x7f);
  fVar150 = auVar8._0_4_;
  auVar97 = ZEXT416((uint)fVar150);
  auVar70 = vrsqrtss_avx(auVar97,auVar97);
  fVar152 = auVar70._0_4_;
  auVar70 = vdpps_avx(auVar11,auVar66,0x7f);
  fVar152 = fVar152 * 1.5 - fVar150 * 0.5 * fVar152 * fVar152 * fVar152;
  fVar244 = fVar152 * auVar11._0_4_;
  fVar254 = fVar152 * auVar11._4_4_;
  fVar255 = fVar152 * auVar11._8_4_;
  fVar256 = fVar152 * auVar11._12_4_;
  auVar181._0_4_ = fVar150 * auVar66._0_4_;
  auVar181._4_4_ = fVar150 * auVar66._4_4_;
  auVar181._8_4_ = fVar150 * auVar66._8_4_;
  auVar181._12_4_ = fVar150 * auVar66._12_4_;
  fVar150 = auVar70._0_4_;
  auVar137._0_4_ = fVar150 * auVar11._0_4_;
  auVar137._4_4_ = fVar150 * auVar11._4_4_;
  auVar137._8_4_ = fVar150 * auVar11._8_4_;
  auVar137._12_4_ = fVar150 * auVar11._12_4_;
  auVar9 = vsubps_avx(auVar181,auVar137);
  auVar70 = vrcpss_avx(auVar97,auVar97);
  auVar8 = vfnmadd213ss_fma(auVar8,auVar70,ZEXT416(0x40000000));
  fVar150 = auVar8._0_4_ * auVar70._0_4_;
  auVar8 = vshufps_avx(_local_668,_local_668,0xff);
  auVar212._0_4_ = auVar8._0_4_ * fVar153;
  auVar212._4_4_ = auVar8._4_4_ * fVar170;
  auVar212._8_4_ = auVar8._8_4_ * fVar172;
  auVar212._12_4_ = auVar8._12_4_ * fVar174;
  local_498 = vsubps_avx(_local_668,auVar212);
  auVar70 = vshufps_avx(auVar75,auVar75,0xff);
  auVar155._0_4_ = auVar70._0_4_ * fVar153 + fVar151 * auVar272._0_4_ * fVar171 * auVar8._0_4_;
  auVar155._4_4_ = auVar70._4_4_ * fVar170 + fVar151 * auVar272._4_4_ * fVar171 * auVar8._4_4_;
  auVar155._8_4_ = auVar70._8_4_ * fVar172 + fVar151 * auVar272._8_4_ * fVar171 * auVar8._8_4_;
  auVar155._12_4_ = auVar70._12_4_ * fVar174 + fVar151 * auVar272._12_4_ * fVar171 * auVar8._12_4_;
  auVar272 = vsubps_avx(auVar75,auVar155);
  local_4a8._0_4_ = auVar212._0_4_ + (float)local_668._0_4_;
  local_4a8._4_4_ = auVar212._4_4_ + (float)local_668._4_4_;
  fStack_4a0 = auVar212._8_4_ + fStack_660;
  fStack_49c = auVar212._12_4_ + fStack_65c;
  auVar8 = vshufps_avx(auVar65,auVar65,0xff);
  auVar98._0_4_ = fVar244 * auVar8._0_4_;
  auVar98._4_4_ = fVar254 * auVar8._4_4_;
  auVar98._8_4_ = fVar255 * auVar8._8_4_;
  auVar98._12_4_ = fVar256 * auVar8._12_4_;
  local_4b8 = vsubps_avx(auVar65,auVar98);
  auVar70 = vshufps_avx(auVar74,auVar74,0xff);
  auVar78._0_4_ = fVar244 * auVar70._0_4_ + auVar8._0_4_ * fVar152 * auVar9._0_4_ * fVar150;
  auVar78._4_4_ = fVar254 * auVar70._4_4_ + auVar8._4_4_ * fVar152 * auVar9._4_4_ * fVar150;
  auVar78._8_4_ = fVar255 * auVar70._8_4_ + auVar8._8_4_ * fVar152 * auVar9._8_4_ * fVar150;
  auVar78._12_4_ = fVar256 * auVar70._12_4_ + auVar8._12_4_ * fVar152 * auVar9._12_4_ * fVar150;
  auVar8 = vsubps_avx(auVar74,auVar78);
  fVar153 = auVar65._0_4_ + auVar98._0_4_;
  fVar170 = auVar65._4_4_ + auVar98._4_4_;
  fVar172 = auVar65._8_4_ + auVar98._8_4_;
  fVar174 = auVar65._12_4_ + auVar98._12_4_;
  local_4c8._0_4_ = local_498._0_4_ + auVar272._0_4_ * 0.33333334;
  local_4c8._4_4_ = local_498._4_4_ + auVar272._4_4_ * 0.33333334;
  local_4c8._8_4_ = local_498._8_4_ + auVar272._8_4_ * 0.33333334;
  local_4c8._12_4_ = local_498._12_4_ + auVar272._12_4_ * 0.33333334;
  auVar79._0_4_ = auVar8._0_4_ * 0.33333334;
  auVar79._4_4_ = auVar8._4_4_ * 0.33333334;
  auVar79._8_4_ = auVar8._8_4_ * 0.33333334;
  auVar79._12_4_ = auVar8._12_4_ * 0.33333334;
  local_4d8 = vsubps_avx(local_4b8,auVar79);
  local_478 = vsubps_avx(local_498,auVar10);
  auVar8 = vshufps_avx(local_478,local_478,0x55);
  auVar70 = vshufps_avx(local_478,local_478,0xaa);
  aVar1 = pre->ray_space[k].vy.field_0;
  fVar171 = pre->ray_space[k].vz.field_0.m128[0];
  fVar150 = pre->ray_space[k].vz.field_0.m128[1];
  fVar151 = pre->ray_space[k].vz.field_0.m128[2];
  fVar152 = pre->ray_space[k].vz.field_0.m128[3];
  auVar80._0_4_ = fVar171 * auVar70._0_4_;
  auVar80._4_4_ = fVar150 * auVar70._4_4_;
  auVar80._8_4_ = fVar151 * auVar70._8_4_;
  auVar80._12_4_ = fVar152 * auVar70._12_4_;
  auVar272 = vfmadd231ps_fma(auVar80,(undefined1  [16])aVar1,auVar8);
  local_488 = vsubps_avx(local_4c8,auVar10);
  auVar8 = vshufps_avx(local_488,local_488,0x55);
  auVar70 = vshufps_avx(local_488,local_488,0xaa);
  auVar81._0_4_ = fVar171 * auVar70._0_4_;
  auVar81._4_4_ = fVar150 * auVar70._4_4_;
  auVar81._8_4_ = fVar151 * auVar70._8_4_;
  auVar81._12_4_ = fVar152 * auVar70._12_4_;
  auVar70 = vfmadd231ps_fma(auVar81,(undefined1  [16])aVar1,auVar8);
  local_2d8 = vsubps_avx(local_4d8,auVar10);
  auVar8 = vshufps_avx(local_2d8,local_2d8,0xaa);
  auVar245._0_4_ = fVar171 * auVar8._0_4_;
  auVar245._4_4_ = fVar150 * auVar8._4_4_;
  auVar245._8_4_ = fVar151 * auVar8._8_4_;
  auVar245._12_4_ = fVar152 * auVar8._12_4_;
  auVar8 = vshufps_avx(local_2d8,local_2d8,0x55);
  auVar9 = vfmadd231ps_fma(auVar245,(undefined1  [16])aVar1,auVar8);
  local_2e8 = vsubps_avx(local_4b8,auVar10);
  auVar8 = vshufps_avx(local_2e8,local_2e8,0xaa);
  auVar82._0_4_ = fVar171 * auVar8._0_4_;
  auVar82._4_4_ = fVar150 * auVar8._4_4_;
  auVar82._8_4_ = fVar151 * auVar8._8_4_;
  auVar82._12_4_ = fVar152 * auVar8._12_4_;
  auVar8 = vshufps_avx(local_2e8,local_2e8,0x55);
  auVar11 = vfmadd231ps_fma(auVar82,(undefined1  [16])aVar1,auVar8);
  local_2f8 = vsubps_avx(_local_4a8,auVar10);
  auVar8 = vshufps_avx(local_2f8,local_2f8,0xaa);
  auVar138._0_4_ = fVar171 * auVar8._0_4_;
  auVar138._4_4_ = fVar150 * auVar8._4_4_;
  auVar138._8_4_ = fVar151 * auVar8._8_4_;
  auVar138._12_4_ = fVar152 * auVar8._12_4_;
  auVar8 = vshufps_avx(local_2f8,local_2f8,0x55);
  auVar66 = vfmadd231ps_fma(auVar138,(undefined1  [16])aVar1,auVar8);
  local_4e8._0_4_ = (fVar62 + auVar155._0_4_) * 0.33333334 + (float)local_4a8._0_4_;
  local_4e8._4_4_ = (fVar147 + auVar155._4_4_) * 0.33333334 + (float)local_4a8._4_4_;
  fStack_4e0 = (fVar149 + auVar155._8_4_) * 0.33333334 + fStack_4a0;
  fStack_4dc = (fVar96 + auVar155._12_4_) * 0.33333334 + fStack_49c;
  local_308 = vsubps_avx(_local_4e8,auVar10);
  auVar8 = vshufps_avx(local_308,local_308,0xaa);
  auVar197._0_4_ = auVar8._0_4_ * fVar171;
  auVar197._4_4_ = auVar8._4_4_ * fVar150;
  auVar197._8_4_ = auVar8._8_4_ * fVar151;
  auVar197._12_4_ = auVar8._12_4_ * fVar152;
  auVar8 = vshufps_avx(local_308,local_308,0x55);
  auVar65 = vfmadd231ps_fma(auVar197,(undefined1  [16])aVar1,auVar8);
  auVar213._0_4_ = (fVar133 + auVar78._0_4_) * 0.33333334;
  auVar213._4_4_ = (fVar148 + auVar78._4_4_) * 0.33333334;
  auVar213._8_4_ = (fVar95 + auVar78._8_4_) * 0.33333334;
  auVar213._12_4_ = (fVar64 + auVar78._12_4_) * 0.33333334;
  auVar45._4_4_ = fVar170;
  auVar45._0_4_ = fVar153;
  auVar45._8_4_ = fVar172;
  auVar45._12_4_ = fVar174;
  _local_4f8 = vsubps_avx(auVar45,auVar213);
  local_318 = vsubps_avx(_local_4f8,auVar10);
  auVar8 = vshufps_avx(local_318,local_318,0xaa);
  auVar214._0_4_ = auVar8._0_4_ * fVar171;
  auVar214._4_4_ = auVar8._4_4_ * fVar150;
  auVar214._8_4_ = auVar8._8_4_ * fVar151;
  auVar214._12_4_ = auVar8._12_4_ * fVar152;
  auVar8 = vshufps_avx(local_318,local_318,0x55);
  auVar97 = vfmadd231ps_fma(auVar214,(undefined1  [16])aVar1,auVar8);
  local_328 = vsubps_avx(auVar45,auVar10);
  auVar8 = vshufps_avx(local_328,local_328,0xaa);
  auVar83._0_4_ = fVar171 * auVar8._0_4_;
  auVar83._4_4_ = fVar150 * auVar8._4_4_;
  auVar83._8_4_ = fVar151 * auVar8._8_4_;
  auVar83._12_4_ = fVar152 * auVar8._12_4_;
  auVar8 = vshufps_avx(local_328,local_328,0x55);
  auVar8 = vfmadd231ps_fma(auVar83,(undefined1  [16])aVar1,auVar8);
  auVar156._4_4_ = local_478._0_4_;
  auVar156._0_4_ = local_478._0_4_;
  auVar156._8_4_ = local_478._0_4_;
  auVar156._12_4_ = local_478._0_4_;
  aVar1 = pre->ray_space[k].vx.field_0;
  auVar74 = vfmadd231ps_fma(auVar272,(undefined1  [16])aVar1,auVar156);
  auVar157._4_4_ = local_488._0_4_;
  auVar157._0_4_ = local_488._0_4_;
  auVar157._8_4_ = local_488._0_4_;
  auVar157._12_4_ = local_488._0_4_;
  auVar200 = vfmadd231ps_fma(auVar70,(undefined1  [16])aVar1,auVar157);
  uVar63 = local_2d8._0_4_;
  auVar158._4_4_ = uVar63;
  auVar158._0_4_ = uVar63;
  auVar158._8_4_ = uVar63;
  auVar158._12_4_ = uVar63;
  auVar75 = vfmadd231ps_fma(auVar9,(undefined1  [16])aVar1,auVar158);
  uVar63 = local_2e8._0_4_;
  auVar159._4_4_ = uVar63;
  auVar159._0_4_ = uVar63;
  auVar159._8_4_ = uVar63;
  auVar159._12_4_ = uVar63;
  auVar108 = vfmadd231ps_fma(auVar11,(undefined1  [16])aVar1,auVar159);
  uVar63 = local_2f8._0_4_;
  auVar160._4_4_ = uVar63;
  auVar160._0_4_ = uVar63;
  auVar160._8_4_ = uVar63;
  auVar160._12_4_ = uVar63;
  auVar66 = vfmadd231ps_fma(auVar66,(undefined1  [16])aVar1,auVar160);
  uVar63 = local_308._0_4_;
  auVar161._4_4_ = uVar63;
  auVar161._0_4_ = uVar63;
  auVar161._8_4_ = uVar63;
  auVar161._12_4_ = uVar63;
  auVar65 = vfmadd231ps_fma(auVar65,(undefined1  [16])aVar1,auVar161);
  uVar63 = local_318._0_4_;
  auVar162._4_4_ = uVar63;
  auVar162._0_4_ = uVar63;
  auVar162._8_4_ = uVar63;
  auVar162._12_4_ = uVar63;
  auVar97 = vfmadd231ps_fma(auVar97,(undefined1  [16])aVar1,auVar162);
  uVar63 = local_328._0_4_;
  auVar163._4_4_ = uVar63;
  auVar163._0_4_ = uVar63;
  auVar163._8_4_ = uVar63;
  auVar163._12_4_ = uVar63;
  auVar119 = vfmadd231ps_fma(auVar8,(undefined1  [16])aVar1,auVar163);
  auVar9 = vmovlhps_avx(auVar74,auVar66);
  auVar10 = vmovlhps_avx(auVar200,auVar65);
  auVar11 = vmovlhps_avx(auVar75,auVar97);
  _local_468 = vmovlhps_avx(auVar108,auVar119);
  auVar8 = vminps_avx(auVar9,auVar10);
  auVar70 = vminps_avx(auVar11,_local_468);
  auVar272 = vminps_avx(auVar8,auVar70);
  auVar8 = vmaxps_avx(auVar9,auVar10);
  auVar70 = vmaxps_avx(auVar11,_local_468);
  auVar8 = vmaxps_avx(auVar8,auVar70);
  auVar70 = vshufpd_avx(auVar272,auVar272,3);
  auVar272 = vminps_avx(auVar272,auVar70);
  auVar70 = vshufpd_avx(auVar8,auVar8,3);
  auVar70 = vmaxps_avx(auVar8,auVar70);
  auVar8 = vandps_avx(auVar277,auVar272);
  auVar70 = vandps_avx(auVar277,auVar70);
  auVar8 = vmaxps_avx(auVar8,auVar70);
  auVar70 = vmovshdup_avx(auVar8);
  auVar8 = vmaxss_avx(auVar70,auVar8);
  local_198 = auVar8._0_4_ * 9.536743e-07;
  local_3e8._8_8_ = auVar74._0_8_;
  local_3e8._0_8_ = auVar74._0_8_;
  local_3f8._8_8_ = auVar200._0_8_;
  local_3f8._0_8_ = auVar200._0_8_;
  local_408._0_8_ = auVar75._0_8_;
  local_408._8_8_ = local_408._0_8_;
  local_668 = auVar108._0_8_;
  local_418._8_8_ = local_668;
  local_418._0_8_ = local_668;
  local_428 = auVar66._0_8_;
  register0x00001348 = local_428;
  register0x000013c8 = auVar65._0_8_;
  local_438 = auVar65._0_8_;
  register0x00001408 = auVar97._0_8_;
  local_448 = auVar97._0_8_;
  register0x00001448 = auVar119._0_8_;
  local_458 = auVar119._0_8_;
  local_2c8 = ZEXT416((uint)local_198);
  fStack_194 = local_198;
  fStack_190 = local_198;
  fStack_18c = local_198;
  fStack_188 = local_198;
  fStack_184 = local_198;
  fStack_180 = local_198;
  fStack_17c = local_198;
  local_1b8 = -local_198;
  fStack_1b4 = local_1b8;
  fStack_1b0 = local_1b8;
  fStack_1ac = local_1b8;
  fStack_1a8 = local_1b8;
  fStack_1a4 = local_1b8;
  fStack_1a0 = local_1b8;
  fStack_19c = local_1b8;
  local_398 = uVar55;
  uStack_394 = uVar55;
  uStack_390 = uVar55;
  uStack_38c = uVar55;
  local_3a8 = uVar3;
  uStack_3a4 = uVar3;
  uStack_3a0 = uVar3;
  uStack_39c = uVar3;
  uVar56 = 0;
  fVar62 = *(float *)(ray + k * 4 + 0x30);
  local_298 = vsubps_avx(auVar10,auVar9);
  local_2a8 = vsubps_avx(auVar11,auVar10);
  local_2b8 = vsubps_avx(_local_468,auVar11);
  local_348 = vsubps_avx(_local_4a8,local_498);
  local_358 = vsubps_avx(_local_4e8,local_4c8);
  local_368 = vsubps_avx(_local_4f8,local_4d8);
  auVar46._4_4_ = fVar170;
  auVar46._0_4_ = fVar153;
  auVar46._8_4_ = fVar172;
  auVar46._12_4_ = fVar174;
  _local_378 = vsubps_avx(auVar46,local_4b8);
  _local_668 = ZEXT816(0x3f80000000000000);
  local_338 = _local_668;
  do {
    auVar8 = vshufps_avx(_local_668,_local_668,0x50);
    auVar109._8_4_ = 0x3f800000;
    auVar109._0_8_ = &DAT_3f8000003f800000;
    auVar109._12_4_ = 0x3f800000;
    auVar115._16_4_ = 0x3f800000;
    auVar115._0_16_ = auVar109;
    auVar115._20_4_ = 0x3f800000;
    auVar115._24_4_ = 0x3f800000;
    auVar115._28_4_ = 0x3f800000;
    auVar70 = vsubps_avx(auVar109,auVar8);
    fVar133 = auVar8._0_4_;
    auVar68._0_4_ = local_428._0_4_ * fVar133;
    fVar147 = auVar8._4_4_;
    auVar68._4_4_ = local_428._4_4_ * fVar147;
    fVar148 = auVar8._8_4_;
    auVar68._8_4_ = local_428._8_4_ * fVar148;
    fVar149 = auVar8._12_4_;
    auVar68._12_4_ = local_428._12_4_ * fVar149;
    auVar139._0_4_ = local_438._0_4_ * fVar133;
    auVar139._4_4_ = local_438._4_4_ * fVar147;
    auVar139._8_4_ = local_438._8_4_ * fVar148;
    auVar139._12_4_ = local_438._12_4_ * fVar149;
    auVar182._0_4_ = local_448._0_4_ * fVar133;
    auVar182._4_4_ = local_448._4_4_ * fVar147;
    auVar182._8_4_ = local_448._8_4_ * fVar148;
    auVar182._12_4_ = local_448._12_4_ * fVar149;
    auVar271._0_4_ = local_458._0_4_ * fVar133;
    auVar271._4_4_ = local_458._4_4_ * fVar147;
    auVar271._8_4_ = local_458._8_4_ * fVar148;
    auVar271._12_4_ = local_458._12_4_ * fVar149;
    auVar65 = vfmadd231ps_fma(auVar68,auVar70,local_3e8);
    auVar97 = vfmadd231ps_fma(auVar139,auVar70,local_3f8);
    auVar74 = vfmadd231ps_fma(auVar182,auVar70,local_408);
    auVar200 = vfmadd231ps_fma(auVar271,local_418,auVar70);
    local_608 = auVar200._0_4_;
    auVar8 = vmovshdup_avx(local_338);
    fVar133 = local_338._0_4_;
    fVar95 = (auVar8._0_4_ - fVar133) * 0.04761905;
    auVar208._4_4_ = fVar133;
    auVar208._0_4_ = fVar133;
    auVar208._8_4_ = fVar133;
    auVar208._12_4_ = fVar133;
    auVar208._16_4_ = fVar133;
    auVar208._20_4_ = fVar133;
    auVar208._24_4_ = fVar133;
    auVar208._28_4_ = fVar133;
    auVar105._0_8_ = auVar8._0_8_;
    auVar105._8_8_ = auVar105._0_8_;
    auVar105._16_8_ = auVar105._0_8_;
    auVar105._24_8_ = auVar105._0_8_;
    auVar72 = vsubps_avx(auVar105,auVar208);
    uVar63 = auVar65._0_4_;
    auVar281._4_4_ = uVar63;
    auVar281._0_4_ = uVar63;
    auVar281._8_4_ = uVar63;
    auVar281._12_4_ = uVar63;
    auVar281._16_4_ = uVar63;
    auVar281._20_4_ = uVar63;
    auVar281._24_4_ = uVar63;
    auVar281._28_4_ = uVar63;
    auVar8 = vmovshdup_avx(auVar65);
    uVar154 = auVar8._0_8_;
    auVar266._8_8_ = uVar154;
    auVar266._0_8_ = uVar154;
    auVar266._16_8_ = uVar154;
    auVar266._24_8_ = uVar154;
    fVar96 = auVar97._0_4_;
    auVar92._4_4_ = fVar96;
    auVar92._0_4_ = fVar96;
    auVar92._8_4_ = fVar96;
    auVar92._12_4_ = fVar96;
    auVar92._16_4_ = fVar96;
    auVar92._20_4_ = fVar96;
    auVar92._24_4_ = fVar96;
    auVar92._28_4_ = fVar96;
    auVar70 = vmovshdup_avx(auVar97);
    auVar167._0_8_ = auVar70._0_8_;
    auVar167._8_8_ = auVar167._0_8_;
    auVar167._16_8_ = auVar167._0_8_;
    auVar167._24_8_ = auVar167._0_8_;
    fVar150 = auVar74._0_4_;
    auVar243._4_4_ = fVar150;
    auVar243._0_4_ = fVar150;
    auVar243._8_4_ = fVar150;
    auVar243._12_4_ = fVar150;
    auVar243._16_4_ = fVar150;
    auVar243._20_4_ = fVar150;
    auVar243._24_4_ = fVar150;
    auVar243._28_4_ = fVar150;
    auVar272 = vmovshdup_avx(auVar74);
    auVar219._0_8_ = auVar272._0_8_;
    auVar219._8_8_ = auVar219._0_8_;
    auVar219._16_8_ = auVar219._0_8_;
    auVar219._24_8_ = auVar219._0_8_;
    auVar66 = vmovshdup_avx(auVar200);
    auVar75 = vfmadd132ps_fma(auVar72,auVar208,_DAT_02020f20);
    auVar72 = vsubps_avx(auVar115,ZEXT1632(auVar75));
    fVar133 = auVar75._0_4_;
    auVar274._0_4_ = fVar96 * fVar133;
    fVar147 = auVar75._4_4_;
    auVar274._4_4_ = fVar96 * fVar147;
    fVar148 = auVar75._8_4_;
    auVar274._8_4_ = fVar96 * fVar148;
    fVar149 = auVar75._12_4_;
    auVar274._12_4_ = fVar96 * fVar149;
    auVar274._16_4_ = fVar96 * 0.0;
    auVar274._20_4_ = fVar96 * 0.0;
    auVar274._24_4_ = fVar96 * 0.0;
    auVar274._28_4_ = 0;
    auVar75 = vfmadd231ps_fma(auVar274,auVar72,auVar281);
    fVar64 = auVar70._0_4_;
    auVar251._0_4_ = fVar64 * fVar133;
    fVar171 = auVar70._4_4_;
    auVar251._4_4_ = fVar171 * fVar147;
    auVar251._8_4_ = fVar64 * fVar148;
    auVar251._12_4_ = fVar171 * fVar149;
    auVar251._16_4_ = fVar64 * 0.0;
    auVar251._20_4_ = fVar171 * 0.0;
    auVar251._24_4_ = fVar64 * 0.0;
    auVar251._28_4_ = 0;
    auVar108 = vfmadd231ps_fma(auVar251,auVar72,auVar266);
    auVar12._4_4_ = fVar150 * fVar147;
    auVar12._0_4_ = fVar150 * fVar133;
    auVar12._8_4_ = fVar150 * fVar148;
    auVar12._12_4_ = fVar150 * fVar149;
    auVar12._16_4_ = fVar150 * 0.0;
    auVar12._20_4_ = fVar150 * 0.0;
    auVar12._24_4_ = fVar150 * 0.0;
    auVar12._28_4_ = auVar8._4_4_;
    auVar119 = vfmadd231ps_fma(auVar12,auVar72,auVar92);
    fVar64 = auVar272._0_4_;
    fVar171 = auVar272._4_4_;
    auVar13._4_4_ = fVar171 * fVar147;
    auVar13._0_4_ = fVar64 * fVar133;
    auVar13._8_4_ = fVar64 * fVar148;
    auVar13._12_4_ = fVar171 * fVar149;
    auVar13._16_4_ = fVar64 * 0.0;
    auVar13._20_4_ = fVar171 * 0.0;
    auVar13._24_4_ = fVar64 * 0.0;
    auVar13._28_4_ = uVar63;
    auVar123 = vfmadd231ps_fma(auVar13,auVar72,auVar167);
    auVar8 = vshufps_avx(auVar65,auVar65,0xaa);
    auVar168._0_8_ = auVar8._0_8_;
    auVar168._8_8_ = auVar168._0_8_;
    auVar168._16_8_ = auVar168._0_8_;
    auVar168._24_8_ = auVar168._0_8_;
    auVar70 = vshufps_avx(auVar65,auVar65,0xff);
    uStack_5a0 = auVar70._0_8_;
    local_5a8 = (undefined1  [8])uStack_5a0;
    uStack_598 = uStack_5a0;
    uStack_590 = uStack_5a0;
    auVar14._4_4_ = fVar147 * local_608;
    auVar14._0_4_ = fVar133 * local_608;
    auVar14._8_4_ = fVar148 * local_608;
    auVar14._12_4_ = fVar149 * local_608;
    auVar14._16_4_ = local_608 * 0.0;
    auVar14._20_4_ = local_608 * 0.0;
    auVar14._24_4_ = local_608 * 0.0;
    auVar14._28_4_ = 0x3f800000;
    auVar73 = vfmadd231ps_fma(auVar14,auVar72,auVar243);
    auVar272 = vshufps_avx(auVar97,auVar97,0xaa);
    auVar131._0_8_ = auVar272._0_8_;
    auVar131._8_8_ = auVar131._0_8_;
    auVar131._16_8_ = auVar131._0_8_;
    auVar131._24_8_ = auVar131._0_8_;
    auVar65 = vshufps_avx(auVar97,auVar97,0xff);
    auVar146._0_8_ = auVar65._0_8_;
    auVar146._8_8_ = auVar146._0_8_;
    auVar146._16_8_ = auVar146._0_8_;
    auVar146._24_8_ = auVar146._0_8_;
    fVar64 = auVar66._0_4_;
    fVar171 = auVar66._4_4_;
    auVar15._4_4_ = fVar171 * fVar147;
    auVar15._0_4_ = fVar64 * fVar133;
    auVar15._8_4_ = fVar64 * fVar148;
    auVar15._12_4_ = fVar171 * fVar149;
    auVar15._16_4_ = fVar64 * 0.0;
    auVar15._20_4_ = fVar171 * 0.0;
    auVar15._24_4_ = fVar64 * 0.0;
    auVar15._28_4_ = fVar150;
    auVar118 = vfmadd231ps_fma(auVar15,auVar72,auVar219);
    auVar16._28_4_ = fVar96;
    auVar16._0_28_ =
         ZEXT1628(CONCAT412(auVar119._12_4_ * fVar149,
                            CONCAT48(auVar119._8_4_ * fVar148,
                                     CONCAT44(auVar119._4_4_ * fVar147,auVar119._0_4_ * fVar133))));
    auVar75 = vfmadd231ps_fma(auVar16,auVar72,ZEXT1632(auVar75));
    auVar17._28_4_ = auVar70._4_4_;
    auVar17._0_28_ =
         ZEXT1628(CONCAT412(auVar123._12_4_ * fVar149,
                            CONCAT48(auVar123._8_4_ * fVar148,
                                     CONCAT44(auVar123._4_4_ * fVar147,auVar123._0_4_ * fVar133))));
    auVar108 = vfmadd231ps_fma(auVar17,auVar72,ZEXT1632(auVar108));
    auVar70 = vshufps_avx(auVar74,auVar74,0xaa);
    uVar154 = auVar70._0_8_;
    auVar252._8_8_ = uVar154;
    auVar252._0_8_ = uVar154;
    auVar252._16_8_ = uVar154;
    auVar252._24_8_ = uVar154;
    auVar66 = vshufps_avx(auVar74,auVar74,0xff);
    uVar154 = auVar66._0_8_;
    auVar275._8_8_ = uVar154;
    auVar275._0_8_ = uVar154;
    auVar275._16_8_ = uVar154;
    auVar275._24_8_ = uVar154;
    auVar119 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar149 * auVar73._12_4_,
                                                  CONCAT48(fVar148 * auVar73._8_4_,
                                                           CONCAT44(fVar147 * auVar73._4_4_,
                                                                    fVar133 * auVar73._0_4_)))),
                               auVar72,ZEXT1632(auVar119));
    auVar97 = vshufps_avx(auVar200,auVar200,0xaa);
    auVar74 = vshufps_avx(auVar200,auVar200,0xff);
    local_608 = auVar74._0_4_;
    fStack_604 = auVar74._4_4_;
    auVar18._28_4_ = fStack_604;
    auVar18._0_28_ =
         ZEXT1628(CONCAT412(auVar118._12_4_ * fVar149,
                            CONCAT48(auVar118._8_4_ * fVar148,
                                     CONCAT44(auVar118._4_4_ * fVar147,auVar118._0_4_ * fVar133))));
    auVar74 = vfmadd231ps_fma(auVar18,auVar72,ZEXT1632(auVar123));
    auVar200 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar149 * auVar119._12_4_,
                                                  CONCAT48(fVar148 * auVar119._8_4_,
                                                           CONCAT44(fVar147 * auVar119._4_4_,
                                                                    fVar133 * auVar119._0_4_)))),
                               auVar72,ZEXT1632(auVar75));
    auVar12 = vsubps_avx(ZEXT1632(auVar119),ZEXT1632(auVar75));
    auVar75 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar149 * auVar74._12_4_,
                                                 CONCAT48(fVar148 * auVar74._8_4_,
                                                          CONCAT44(fVar147 * auVar74._4_4_,
                                                                   fVar133 * auVar74._0_4_)))),
                              auVar72,ZEXT1632(auVar108));
    auVar13 = vsubps_avx(ZEXT1632(auVar74),ZEXT1632(auVar108));
    fVar244 = fVar95 * auVar12._0_4_ * 3.0;
    fVar255 = fVar95 * auVar12._4_4_ * 3.0;
    auVar253._4_4_ = fVar255;
    auVar253._0_4_ = fVar244;
    fVar231 = fVar95 * auVar12._8_4_ * 3.0;
    auVar253._8_4_ = fVar231;
    fVar232 = fVar95 * auVar12._12_4_ * 3.0;
    auVar253._12_4_ = fVar232;
    fVar233 = fVar95 * auVar12._16_4_ * 3.0;
    auVar253._16_4_ = fVar233;
    fVar234 = fVar95 * auVar12._20_4_ * 3.0;
    auVar253._20_4_ = fVar234;
    fVar235 = fVar95 * auVar12._24_4_ * 3.0;
    auVar253._24_4_ = fVar235;
    auVar253._28_4_ = 0x40400000;
    local_628._0_4_ = fVar95 * auVar13._0_4_ * 3.0;
    local_628._4_4_ = fVar95 * auVar13._4_4_ * 3.0;
    fStack_620 = fVar95 * auVar13._8_4_ * 3.0;
    fStack_61c = fVar95 * auVar13._12_4_ * 3.0;
    fStack_618 = fVar95 * auVar13._16_4_ * 3.0;
    fStack_614 = fVar95 * auVar13._20_4_ * 3.0;
    fStack_610 = fVar95 * auVar13._24_4_ * 3.0;
    fStack_60c = auVar13._28_4_;
    fVar96 = auVar272._0_4_;
    fVar64 = auVar272._4_4_;
    auVar20._4_4_ = fVar64 * fVar147;
    auVar20._0_4_ = fVar96 * fVar133;
    auVar20._8_4_ = fVar96 * fVar148;
    auVar20._12_4_ = fVar64 * fVar149;
    auVar20._16_4_ = fVar96 * 0.0;
    auVar20._20_4_ = fVar64 * 0.0;
    auVar20._24_4_ = fVar96 * 0.0;
    auVar20._28_4_ = auVar12._28_4_;
    auVar272 = vfmadd231ps_fma(auVar20,auVar72,auVar168);
    fVar96 = auVar65._0_4_;
    fVar171 = auVar65._4_4_;
    auVar21._4_4_ = fVar171 * fVar147;
    auVar21._0_4_ = fVar96 * fVar133;
    auVar21._8_4_ = fVar96 * fVar148;
    auVar21._12_4_ = fVar171 * fVar149;
    auVar21._16_4_ = fVar96 * 0.0;
    auVar21._20_4_ = fVar171 * 0.0;
    auVar21._24_4_ = fVar96 * 0.0;
    auVar21._28_4_ = auVar8._4_4_;
    auVar8 = vfmadd231ps_fma(auVar21,auVar72,_local_5a8);
    fVar96 = auVar70._0_4_;
    fVar171 = auVar70._4_4_;
    auVar22._4_4_ = fVar171 * fVar147;
    auVar22._0_4_ = fVar96 * fVar133;
    auVar22._8_4_ = fVar96 * fVar148;
    auVar22._12_4_ = fVar171 * fVar149;
    auVar22._16_4_ = fVar96 * 0.0;
    auVar22._20_4_ = fVar171 * 0.0;
    auVar22._24_4_ = fVar96 * 0.0;
    auVar22._28_4_ = fVar95;
    auVar70 = vfmadd231ps_fma(auVar22,auVar72,auVar131);
    fVar96 = auVar66._0_4_;
    fVar150 = auVar66._4_4_;
    auVar23._4_4_ = fVar150 * fVar147;
    auVar23._0_4_ = fVar96 * fVar133;
    auVar23._8_4_ = fVar96 * fVar148;
    auVar23._12_4_ = fVar150 * fVar149;
    auVar23._16_4_ = fVar96 * 0.0;
    auVar23._20_4_ = fVar150 * 0.0;
    auVar23._24_4_ = fVar96 * 0.0;
    auVar23._28_4_ = fVar64;
    auVar66 = vfmadd231ps_fma(auVar23,auVar72,auVar146);
    local_3d8 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar200));
    fVar96 = auVar97._0_4_;
    fVar64 = auVar97._4_4_;
    auVar24._4_4_ = fVar64 * fVar147;
    auVar24._0_4_ = fVar96 * fVar133;
    auVar24._8_4_ = fVar96 * fVar148;
    auVar24._12_4_ = fVar64 * fVar149;
    auVar24._16_4_ = fVar96 * 0.0;
    auVar24._20_4_ = fVar64 * 0.0;
    auVar24._24_4_ = fVar96 * 0.0;
    auVar24._28_4_ = local_3d8._28_4_;
    auVar65 = vfmadd231ps_fma(auVar24,auVar72,auVar252);
    auVar16 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar75));
    auVar25._4_4_ = fVar147 * fStack_604;
    auVar25._0_4_ = fVar133 * local_608;
    auVar25._8_4_ = fVar148 * local_608;
    auVar25._12_4_ = fVar149 * fStack_604;
    auVar25._16_4_ = local_608 * 0.0;
    auVar25._20_4_ = fStack_604 * 0.0;
    auVar25._24_4_ = local_608 * 0.0;
    auVar25._28_4_ = fVar171;
    auVar97 = vfmadd231ps_fma(auVar25,auVar72,auVar275);
    auVar26._28_4_ = fVar64;
    auVar26._0_28_ =
         ZEXT1628(CONCAT412(fVar149 * auVar70._12_4_,
                            CONCAT48(fVar148 * auVar70._8_4_,
                                     CONCAT44(fVar147 * auVar70._4_4_,fVar133 * auVar70._0_4_))));
    auVar272 = vfmadd231ps_fma(auVar26,auVar72,ZEXT1632(auVar272));
    auVar8 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar149 * auVar66._12_4_,
                                                CONCAT48(fVar148 * auVar66._8_4_,
                                                         CONCAT44(fVar147 * auVar66._4_4_,
                                                                  fVar133 * auVar66._0_4_)))),
                             auVar72,ZEXT1632(auVar8));
    fVar244 = auVar200._0_4_ + fVar244;
    fVar255 = auVar200._4_4_ + fVar255;
    fVar231 = auVar200._8_4_ + fVar231;
    fVar232 = auVar200._12_4_ + fVar232;
    fVar233 = fVar233 + 0.0;
    fVar234 = fVar234 + 0.0;
    fVar235 = fVar235 + 0.0;
    auVar27._28_4_ = 0x40400000;
    auVar27._0_28_ =
         ZEXT1628(CONCAT412(auVar97._12_4_ * fVar149,
                            CONCAT48(auVar97._8_4_ * fVar148,
                                     CONCAT44(auVar97._4_4_ * fVar147,auVar97._0_4_ * fVar133))));
    auVar70 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar149 * auVar65._12_4_,
                                                 CONCAT48(fVar148 * auVar65._8_4_,
                                                          CONCAT44(fVar147 * auVar65._4_4_,
                                                                   fVar133 * auVar65._0_4_)))),
                              auVar72,ZEXT1632(auVar70));
    auVar66 = vfmadd231ps_fma(auVar27,auVar72,ZEXT1632(auVar66));
    auVar65 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar149 * auVar70._12_4_,
                                                 CONCAT48(fVar148 * auVar70._8_4_,
                                                          CONCAT44(fVar147 * auVar70._4_4_,
                                                                   fVar133 * auVar70._0_4_)))),
                              auVar72,ZEXT1632(auVar272));
    auVar97 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar149 * auVar66._12_4_,
                                                 CONCAT48(fVar148 * auVar66._8_4_,
                                                          CONCAT44(fVar147 * auVar66._4_4_,
                                                                   fVar133 * auVar66._0_4_)))),
                              ZEXT1632(auVar8),auVar72);
    auVar72 = vsubps_avx(ZEXT1632(auVar70),ZEXT1632(auVar272));
    auVar12 = vsubps_avx(ZEXT1632(auVar66),ZEXT1632(auVar8));
    fVar133 = fVar95 * auVar72._0_4_ * 3.0;
    fVar147 = fVar95 * auVar72._4_4_ * 3.0;
    auVar28._4_4_ = fVar147;
    auVar28._0_4_ = fVar133;
    fVar148 = fVar95 * auVar72._8_4_ * 3.0;
    auVar28._8_4_ = fVar148;
    fVar149 = fVar95 * auVar72._12_4_ * 3.0;
    auVar28._12_4_ = fVar149;
    fVar150 = fVar95 * auVar72._16_4_ * 3.0;
    auVar28._16_4_ = fVar150;
    fVar151 = fVar95 * auVar72._20_4_ * 3.0;
    auVar28._20_4_ = fVar151;
    fVar152 = fVar95 * auVar72._24_4_ * 3.0;
    auVar28._24_4_ = fVar152;
    auVar28._28_4_ = 0x40400000;
    auVar192._0_4_ = fVar95 * auVar12._0_4_ * 3.0;
    auVar192._4_4_ = fVar95 * auVar12._4_4_ * 3.0;
    auVar192._8_4_ = fVar95 * auVar12._8_4_ * 3.0;
    auVar192._12_4_ = fVar95 * auVar12._12_4_ * 3.0;
    auVar192._16_4_ = fVar95 * auVar12._16_4_ * 3.0;
    auVar192._20_4_ = fVar95 * auVar12._20_4_ * 3.0;
    auVar192._24_4_ = fVar95 * auVar12._24_4_ * 3.0;
    auVar192._28_4_ = 0;
    auVar17 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar65));
    local_78 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar97));
    auVar72 = vsubps_avx(ZEXT1632(auVar65),ZEXT1632(auVar200));
    auVar12 = vsubps_avx(ZEXT1632(auVar97),ZEXT1632(auVar75));
    auVar14 = vsubps_avx(auVar17,local_3d8);
    fVar254 = auVar72._0_4_ + auVar14._0_4_;
    fVar256 = auVar72._4_4_ + auVar14._4_4_;
    fVar173 = auVar72._8_4_ + auVar14._8_4_;
    fVar175 = auVar72._12_4_ + auVar14._12_4_;
    fVar176 = auVar72._16_4_ + auVar14._16_4_;
    fVar177 = auVar72._20_4_ + auVar14._20_4_;
    fVar178 = auVar72._24_4_ + auVar14._24_4_;
    auVar15 = vsubps_avx(local_78,auVar16);
    auVar267._0_4_ = auVar12._0_4_ + auVar15._0_4_;
    auVar267._4_4_ = auVar12._4_4_ + auVar15._4_4_;
    auVar267._8_4_ = auVar12._8_4_ + auVar15._8_4_;
    auVar267._12_4_ = auVar12._12_4_ + auVar15._12_4_;
    auVar267._16_4_ = auVar12._16_4_ + auVar15._16_4_;
    auVar267._20_4_ = auVar12._20_4_ + auVar15._20_4_;
    auVar267._24_4_ = auVar12._24_4_ + auVar15._24_4_;
    auVar267._28_4_ = auVar12._28_4_ + auVar15._28_4_;
    fVar95 = auVar75._0_4_;
    local_158 = fVar95 + (float)local_628._0_4_;
    fVar96 = auVar75._4_4_;
    fStack_154 = fVar96 + (float)local_628._4_4_;
    fVar64 = auVar75._8_4_;
    fStack_150 = fVar64 + fStack_620;
    fVar171 = auVar75._12_4_;
    fStack_14c = fVar171 + fStack_61c;
    fStack_148 = fStack_618 + 0.0;
    fStack_144 = fStack_614 + 0.0;
    fStack_140 = fStack_610 + 0.0;
    fStack_13c = auVar13._28_4_ + 0.0;
    local_98 = ZEXT1632(auVar200);
    auVar12 = vsubps_avx(local_98,auVar253);
    local_d8 = vpermps_avx2(_DAT_0205d4a0,auVar12);
    local_b8 = ZEXT1632(auVar75);
    auVar12 = vsubps_avx(local_b8,_local_628);
    local_178 = vpermps_avx2(_DAT_0205d4a0,auVar12);
    local_f8._0_4_ = auVar65._0_4_ + fVar133;
    local_f8._4_4_ = auVar65._4_4_ + fVar147;
    local_f8._8_4_ = auVar65._8_4_ + fVar148;
    local_f8._12_4_ = auVar65._12_4_ + fVar149;
    local_f8._16_4_ = fVar150 + 0.0;
    local_f8._20_4_ = fVar151 + 0.0;
    local_f8._24_4_ = fVar152 + 0.0;
    local_f8._28_4_ = 0x40400000;
    auVar253 = ZEXT1632(auVar65);
    auVar12 = vsubps_avx(auVar253,auVar28);
    auVar18 = vpermps_avx2(_DAT_0205d4a0,auVar12);
    fVar133 = auVar97._0_4_;
    local_138._0_4_ = fVar133 + auVar192._0_4_;
    fVar147 = auVar97._4_4_;
    local_138._4_4_ = fVar147 + auVar192._4_4_;
    fVar148 = auVar97._8_4_;
    local_138._8_4_ = fVar148 + auVar192._8_4_;
    fVar149 = auVar97._12_4_;
    local_138._12_4_ = fVar149 + auVar192._12_4_;
    local_138._16_4_ = auVar192._16_4_ + 0.0;
    local_138._20_4_ = auVar192._20_4_ + 0.0;
    local_138._24_4_ = auVar192._24_4_ + 0.0;
    local_138._28_4_ = 0;
    auVar12 = vsubps_avx(ZEXT1632(auVar97),auVar192);
    local_118 = vpermps_avx2(_DAT_0205d4a0,auVar12);
    auVar29._4_4_ = fVar96 * fVar256;
    auVar29._0_4_ = fVar95 * fVar254;
    auVar29._8_4_ = fVar64 * fVar173;
    auVar29._12_4_ = fVar171 * fVar175;
    auVar29._16_4_ = fVar176 * 0.0;
    auVar29._20_4_ = fVar177 * 0.0;
    auVar29._24_4_ = fVar178 * 0.0;
    auVar29._28_4_ = auVar12._28_4_;
    auVar8 = vfnmadd231ps_fma(auVar29,local_98,auVar267);
    auVar30._4_4_ = fStack_154 * fVar256;
    auVar30._0_4_ = local_158 * fVar254;
    auVar30._8_4_ = fStack_150 * fVar173;
    auVar30._12_4_ = fStack_14c * fVar175;
    auVar30._16_4_ = fStack_148 * fVar176;
    auVar30._20_4_ = fStack_144 * fVar177;
    auVar30._24_4_ = fStack_140 * fVar178;
    auVar30._28_4_ = auVar18._28_4_;
    auVar43._4_4_ = fVar255;
    auVar43._0_4_ = fVar244;
    auVar43._8_4_ = fVar231;
    auVar43._12_4_ = fVar232;
    auVar43._16_4_ = fVar233;
    auVar43._20_4_ = fVar234;
    auVar43._24_4_ = fVar235;
    auVar43._28_4_ = 0x40400000;
    auVar70 = vfnmadd231ps_fma(auVar30,auVar267,auVar43);
    auVar31._4_4_ = local_178._4_4_ * fVar256;
    auVar31._0_4_ = local_178._0_4_ * fVar254;
    auVar31._8_4_ = local_178._8_4_ * fVar173;
    auVar31._12_4_ = local_178._12_4_ * fVar175;
    auVar31._16_4_ = local_178._16_4_ * fVar176;
    auVar31._20_4_ = local_178._20_4_ * fVar177;
    auVar31._24_4_ = local_178._24_4_ * fVar178;
    auVar31._28_4_ = fStack_13c;
    auVar272 = vfnmadd231ps_fma(auVar31,local_d8,auVar267);
    local_5a8._0_4_ = auVar16._0_4_;
    local_5a8._4_4_ = auVar16._4_4_;
    uStack_5a0._0_4_ = auVar16._8_4_;
    uStack_5a0._4_4_ = auVar16._12_4_;
    uStack_598._0_4_ = auVar16._16_4_;
    uStack_598._4_4_ = auVar16._20_4_;
    uStack_590._0_4_ = auVar16._24_4_;
    auVar32._4_4_ = fVar256 * (float)local_5a8._4_4_;
    auVar32._0_4_ = fVar254 * (float)local_5a8._0_4_;
    auVar32._8_4_ = fVar173 * (float)uStack_5a0;
    auVar32._12_4_ = fVar175 * uStack_5a0._4_4_;
    auVar32._16_4_ = fVar176 * (float)uStack_598;
    auVar32._20_4_ = fVar177 * uStack_598._4_4_;
    auVar32._24_4_ = fVar178 * (float)uStack_590;
    auVar32._28_4_ = local_178._28_4_;
    auVar66 = vfnmadd231ps_fma(auVar32,local_3d8,auVar267);
    auVar51._4_4_ = fVar147 * fVar256;
    auVar51._0_4_ = fVar133 * fVar254;
    auVar51._8_4_ = fVar148 * fVar173;
    auVar51._12_4_ = fVar149 * fVar175;
    auVar51._16_4_ = fVar176 * 0.0;
    auVar51._20_4_ = fVar177 * 0.0;
    auVar51._24_4_ = fVar178 * 0.0;
    auVar51._28_4_ = DAT_0205d4a0._28_4_;
    auVar65 = vfnmadd231ps_fma(auVar51,auVar253,auVar267);
    auVar33._4_4_ = local_138._4_4_ * fVar256;
    auVar33._0_4_ = local_138._0_4_ * fVar254;
    auVar33._8_4_ = local_138._8_4_ * fVar173;
    auVar33._12_4_ = local_138._12_4_ * fVar175;
    auVar33._16_4_ = local_138._16_4_ * fVar176;
    auVar33._20_4_ = local_138._20_4_ * fVar177;
    auVar33._24_4_ = local_138._24_4_ * fVar178;
    auVar33._28_4_ = local_3d8._28_4_;
    auVar74 = vfnmadd231ps_fma(auVar33,local_f8,auVar267);
    auVar34._4_4_ = local_118._4_4_ * fVar256;
    auVar34._0_4_ = local_118._0_4_ * fVar254;
    auVar34._8_4_ = local_118._8_4_ * fVar173;
    auVar34._12_4_ = local_118._12_4_ * fVar175;
    auVar34._16_4_ = local_118._16_4_ * fVar176;
    auVar34._20_4_ = local_118._20_4_ * fVar177;
    auVar34._24_4_ = local_118._24_4_ * fVar178;
    auVar34._28_4_ = local_d8._28_4_;
    auVar200 = vfnmadd231ps_fma(auVar34,auVar267,auVar18);
    auVar35._4_4_ = local_78._4_4_ * fVar256;
    auVar35._0_4_ = local_78._0_4_ * fVar254;
    auVar35._8_4_ = local_78._8_4_ * fVar173;
    auVar35._12_4_ = local_78._12_4_ * fVar175;
    auVar35._16_4_ = local_78._16_4_ * fVar176;
    auVar35._20_4_ = local_78._20_4_ * fVar177;
    auVar35._24_4_ = local_78._24_4_ * fVar178;
    auVar35._28_4_ = auVar72._28_4_ + auVar14._28_4_;
    auVar75 = vfnmadd231ps_fma(auVar35,auVar267,auVar17);
    auVar12 = vminps_avx(ZEXT1632(auVar8),ZEXT1632(auVar70));
    auVar72 = vmaxps_avx(ZEXT1632(auVar8),ZEXT1632(auVar70));
    auVar13 = vminps_avx(ZEXT1632(auVar272),ZEXT1632(auVar66));
    auVar13 = vminps_avx(auVar12,auVar13);
    auVar12 = vmaxps_avx(ZEXT1632(auVar272),ZEXT1632(auVar66));
    auVar72 = vmaxps_avx(auVar72,auVar12);
    auVar14 = vminps_avx(ZEXT1632(auVar65),ZEXT1632(auVar74));
    auVar12 = vmaxps_avx(ZEXT1632(auVar65),ZEXT1632(auVar74));
    auVar15 = vminps_avx(ZEXT1632(auVar200),ZEXT1632(auVar75));
    auVar14 = vminps_avx(auVar14,auVar15);
    auVar14 = vminps_avx(auVar13,auVar14);
    auVar13 = vmaxps_avx(ZEXT1632(auVar200),ZEXT1632(auVar75));
    auVar12 = vmaxps_avx(auVar12,auVar13);
    auVar12 = vmaxps_avx(auVar72,auVar12);
    auVar50._4_4_ = fStack_194;
    auVar50._0_4_ = local_198;
    auVar50._8_4_ = fStack_190;
    auVar50._12_4_ = fStack_18c;
    auVar50._16_4_ = fStack_188;
    auVar50._20_4_ = fStack_184;
    auVar50._24_4_ = fStack_180;
    auVar50._28_4_ = fStack_17c;
    auVar72 = vcmpps_avx(auVar14,auVar50,2);
    auVar49._4_4_ = fStack_1b4;
    auVar49._0_4_ = local_1b8;
    auVar49._8_4_ = fStack_1b0;
    auVar49._12_4_ = fStack_1ac;
    auVar49._16_4_ = fStack_1a8;
    auVar49._20_4_ = fStack_1a4;
    auVar49._24_4_ = fStack_1a0;
    auVar49._28_4_ = fStack_19c;
    auVar12 = vcmpps_avx(auVar12,auVar49,5);
    auVar72 = vandps_avx(auVar12,auVar72);
    auVar12 = local_288 & auVar72;
    uVar53 = 0;
    if ((((((((auVar12 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar12 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar12 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar12 >> 0x7f,0) != '\0') ||
          (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar12 >> 0xbf,0) != '\0') ||
        (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar12[0x1f] < '\0')
    {
      auVar12 = vsubps_avx(local_3d8,local_98);
      auVar13 = vsubps_avx(auVar17,auVar253);
      fVar151 = auVar12._0_4_ + auVar13._0_4_;
      fVar152 = auVar12._4_4_ + auVar13._4_4_;
      fVar254 = auVar12._8_4_ + auVar13._8_4_;
      fVar256 = auVar12._12_4_ + auVar13._12_4_;
      fVar173 = auVar12._16_4_ + auVar13._16_4_;
      fVar175 = auVar12._20_4_ + auVar13._20_4_;
      fVar176 = auVar12._24_4_ + auVar13._24_4_;
      auVar14 = vsubps_avx(auVar16,local_b8);
      auVar15 = vsubps_avx(local_78,ZEXT1632(auVar97));
      auVar93._0_4_ = auVar14._0_4_ + auVar15._0_4_;
      auVar93._4_4_ = auVar14._4_4_ + auVar15._4_4_;
      auVar93._8_4_ = auVar14._8_4_ + auVar15._8_4_;
      auVar93._12_4_ = auVar14._12_4_ + auVar15._12_4_;
      auVar93._16_4_ = auVar14._16_4_ + auVar15._16_4_;
      auVar93._20_4_ = auVar14._20_4_ + auVar15._20_4_;
      auVar93._24_4_ = auVar14._24_4_ + auVar15._24_4_;
      fVar150 = auVar15._28_4_;
      auVar93._28_4_ = auVar14._28_4_ + fVar150;
      auVar276._0_4_ = fVar95 * fVar151;
      auVar276._4_4_ = fVar96 * fVar152;
      auVar276._8_4_ = fVar64 * fVar254;
      auVar276._12_4_ = fVar171 * fVar256;
      auVar276._16_4_ = fVar173 * 0.0;
      auVar276._20_4_ = fVar175 * 0.0;
      auVar276._24_4_ = fVar176 * 0.0;
      auVar276._28_4_ = 0;
      auVar65 = vfnmadd231ps_fma(auVar276,auVar93,local_98);
      auVar36._4_4_ = fVar152 * fStack_154;
      auVar36._0_4_ = fVar151 * local_158;
      auVar36._8_4_ = fVar254 * fStack_150;
      auVar36._12_4_ = fVar256 * fStack_14c;
      auVar36._16_4_ = fVar173 * fStack_148;
      auVar36._20_4_ = fVar175 * fStack_144;
      auVar36._24_4_ = fVar176 * fStack_140;
      auVar36._28_4_ = fVar150;
      auVar44._4_4_ = fVar255;
      auVar44._0_4_ = fVar244;
      auVar44._8_4_ = fVar231;
      auVar44._12_4_ = fVar232;
      auVar44._16_4_ = fVar233;
      auVar44._20_4_ = fVar234;
      auVar44._24_4_ = fVar235;
      auVar44._28_4_ = 0x40400000;
      auVar8 = vfnmadd213ps_fma(auVar44,auVar93,auVar36);
      auVar37._4_4_ = fVar152 * local_178._4_4_;
      auVar37._0_4_ = fVar151 * local_178._0_4_;
      auVar37._8_4_ = fVar254 * local_178._8_4_;
      auVar37._12_4_ = fVar256 * local_178._12_4_;
      auVar37._16_4_ = fVar173 * local_178._16_4_;
      auVar37._20_4_ = fVar175 * local_178._20_4_;
      auVar37._24_4_ = fVar176 * local_178._24_4_;
      auVar37._28_4_ = fVar150;
      auVar70 = vfnmadd213ps_fma(local_d8,auVar93,auVar37);
      auVar38._4_4_ = (float)local_5a8._4_4_ * fVar152;
      auVar38._0_4_ = (float)local_5a8._0_4_ * fVar151;
      auVar38._8_4_ = (float)uStack_5a0 * fVar254;
      auVar38._12_4_ = uStack_5a0._4_4_ * fVar256;
      auVar38._16_4_ = (float)uStack_598 * fVar173;
      auVar38._20_4_ = uStack_598._4_4_ * fVar175;
      auVar38._24_4_ = (float)uStack_590 * fVar176;
      auVar38._28_4_ = fVar150;
      auVar97 = vfnmadd231ps_fma(auVar38,auVar93,local_3d8);
      auVar106._0_4_ = fVar133 * fVar151;
      auVar106._4_4_ = fVar147 * fVar152;
      auVar106._8_4_ = fVar148 * fVar254;
      auVar106._12_4_ = fVar149 * fVar256;
      auVar106._16_4_ = fVar173 * 0.0;
      auVar106._20_4_ = fVar175 * 0.0;
      auVar106._24_4_ = fVar176 * 0.0;
      auVar106._28_4_ = 0;
      auVar74 = vfnmadd231ps_fma(auVar106,auVar93,auVar253);
      auVar39._4_4_ = fVar152 * local_138._4_4_;
      auVar39._0_4_ = fVar151 * local_138._0_4_;
      auVar39._8_4_ = fVar254 * local_138._8_4_;
      auVar39._12_4_ = fVar256 * local_138._12_4_;
      auVar39._16_4_ = fVar173 * local_138._16_4_;
      auVar39._20_4_ = fVar175 * local_138._20_4_;
      auVar39._24_4_ = fVar176 * local_138._24_4_;
      auVar39._28_4_ = auVar16._28_4_;
      auVar272 = vfnmadd213ps_fma(local_f8,auVar93,auVar39);
      auVar40._4_4_ = fVar152 * local_118._4_4_;
      auVar40._0_4_ = fVar151 * local_118._0_4_;
      auVar40._8_4_ = fVar254 * local_118._8_4_;
      auVar40._12_4_ = fVar256 * local_118._12_4_;
      auVar40._16_4_ = fVar173 * local_118._16_4_;
      auVar40._20_4_ = fVar175 * local_118._20_4_;
      auVar40._24_4_ = fVar176 * local_118._24_4_;
      auVar40._28_4_ = auVar16._28_4_;
      auVar66 = vfnmadd213ps_fma(auVar18,auVar93,auVar40);
      auVar41._4_4_ = local_78._4_4_ * fVar152;
      auVar41._0_4_ = local_78._0_4_ * fVar151;
      auVar41._8_4_ = local_78._8_4_ * fVar254;
      auVar41._12_4_ = local_78._12_4_ * fVar256;
      auVar41._16_4_ = local_78._16_4_ * fVar173;
      auVar41._20_4_ = local_78._20_4_ * fVar175;
      auVar41._24_4_ = local_78._24_4_ * fVar176;
      auVar41._28_4_ = auVar12._28_4_ + auVar13._28_4_;
      auVar200 = vfnmadd231ps_fma(auVar41,auVar93,auVar17);
      auVar13 = vminps_avx(ZEXT1632(auVar65),ZEXT1632(auVar8));
      auVar12 = vmaxps_avx(ZEXT1632(auVar65),ZEXT1632(auVar8));
      auVar14 = vminps_avx(ZEXT1632(auVar70),ZEXT1632(auVar97));
      auVar14 = vminps_avx(auVar13,auVar14);
      auVar13 = vmaxps_avx(ZEXT1632(auVar70),ZEXT1632(auVar97));
      auVar12 = vmaxps_avx(auVar12,auVar13);
      auVar15 = vminps_avx(ZEXT1632(auVar74),ZEXT1632(auVar272));
      auVar13 = vmaxps_avx(ZEXT1632(auVar74),ZEXT1632(auVar272));
      auVar16 = vminps_avx(ZEXT1632(auVar66),ZEXT1632(auVar200));
      auVar15 = vminps_avx(auVar15,auVar16);
      auVar15 = vminps_avx(auVar14,auVar15);
      auVar14 = vmaxps_avx(ZEXT1632(auVar66),ZEXT1632(auVar200));
      auVar13 = vmaxps_avx(auVar13,auVar14);
      auVar13 = vmaxps_avx(auVar12,auVar13);
      auVar12 = vcmpps_avx(auVar15,auVar50,2);
      auVar13 = vcmpps_avx(auVar13,auVar49,5);
      auVar12 = vandps_avx(auVar13,auVar12);
      auVar72 = vandps_avx(auVar72,local_288);
      auVar13 = auVar72 & auVar12;
      if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar13 >> 0x7f,0) != '\0') ||
            (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar13 >> 0xbf,0) != '\0') ||
          (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar13[0x1f] < '\0') {
        auVar72 = vandps_avx(auVar12,auVar72);
        uVar53 = vmovmskps_avx(auVar72);
      }
    }
    if (uVar53 != 0) {
      auStack_3b8[uVar56] = uVar53;
      uVar154 = vmovlps_avx(local_338);
      *(undefined8 *)(&uStack_268 + uVar56 * 2) = uVar154;
      uVar61 = vmovlps_avx(_local_668);
      auStack_58[uVar56] = uVar61;
      uVar56 = (ulong)((int)uVar56 + 1);
    }
    do {
      if ((int)uVar56 == 0) {
        uVar63 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar71._4_4_ = uVar63;
        auVar71._0_4_ = uVar63;
        auVar71._8_4_ = uVar63;
        auVar71._12_4_ = uVar63;
        auVar8 = vcmpps_avx(local_388,auVar71,2);
        uVar55 = vmovmskps_avx(auVar8);
        uVar52 = uVar52 & uVar52 + 0xf & uVar55;
        if (uVar52 == 0) {
          return;
        }
        goto LAB_016a9c6b;
      }
      uVar54 = (int)uVar56 - 1;
      uVar57 = (ulong)uVar54;
      uVar60 = auStack_3b8[uVar57];
      uVar53 = (&uStack_268)[uVar57 * 2];
      fVar133 = afStack_264[uVar57 * 2];
      iVar19 = 0;
      for (uVar61 = (ulong)uVar60; (uVar61 & 1) == 0; uVar61 = uVar61 >> 1 | 0x8000000000000000) {
        iVar19 = iVar19 + 1;
      }
      uVar60 = uVar60 - 1 & uVar60;
      if (uVar60 == 0) {
        uVar56 = (ulong)uVar54;
      }
      register0x00001348 = 0;
      local_668 = (undefined1  [8])auStack_58[uVar57];
      auStack_3b8[uVar57] = uVar60;
      fVar147 = (float)(iVar19 + 1) * 0.14285715;
      auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar133 * (float)iVar19 * 0.14285715)),ZEXT416(uVar53)
                               ,ZEXT416((uint)(1.0 - (float)iVar19 * 0.14285715)));
      auVar70 = vfmadd231ss_fma(ZEXT416((uint)(fVar133 * fVar147)),ZEXT416(uVar53),
                                ZEXT416((uint)(1.0 - fVar147)));
      auVar169._0_4_ = auVar8._0_4_;
      fVar147 = auVar70._0_4_;
      fVar133 = fVar147 - auVar169._0_4_;
      if (0.16666667 <= fVar133) break;
      auVar272 = vshufps_avx(_local_668,_local_668,0x50);
      auVar99._8_4_ = 0x3f800000;
      auVar99._0_8_ = &DAT_3f8000003f800000;
      auVar99._12_4_ = 0x3f800000;
      auVar66 = vsubps_avx(auVar99,auVar272);
      fVar148 = auVar272._0_4_;
      auVar110._0_4_ = fVar148 * (float)local_428._0_4_;
      fVar149 = auVar272._4_4_;
      auVar110._4_4_ = fVar149 * (float)local_428._4_4_;
      fVar95 = auVar272._8_4_;
      auVar110._8_4_ = fVar95 * fStack_420;
      fVar96 = auVar272._12_4_;
      auVar110._12_4_ = fVar96 * fStack_41c;
      auVar121._0_4_ = fVar148 * (float)local_438._0_4_;
      auVar121._4_4_ = fVar149 * (float)local_438._4_4_;
      auVar121._8_4_ = fVar95 * fStack_430;
      auVar121._12_4_ = fVar96 * fStack_42c;
      auVar140._0_4_ = fVar148 * (float)local_448._0_4_;
      auVar140._4_4_ = fVar149 * (float)local_448._4_4_;
      auVar140._8_4_ = fVar95 * fStack_440;
      auVar140._12_4_ = fVar96 * fStack_43c;
      auVar84._0_4_ = fVar148 * (float)local_458._0_4_;
      auVar84._4_4_ = fVar149 * (float)local_458._4_4_;
      auVar84._8_4_ = fVar95 * fStack_450;
      auVar84._12_4_ = fVar96 * fStack_44c;
      auVar272 = vfmadd231ps_fma(auVar110,auVar66,local_3e8);
      auVar65 = vfmadd231ps_fma(auVar121,auVar66,local_3f8);
      auVar97 = vfmadd231ps_fma(auVar140,auVar66,local_408);
      auVar66 = vfmadd231ps_fma(auVar84,auVar66,local_418);
      auVar107._16_16_ = auVar272;
      auVar107._0_16_ = auVar272;
      auVar116._16_16_ = auVar65;
      auVar116._0_16_ = auVar65;
      auVar132._16_16_ = auVar97;
      auVar132._0_16_ = auVar97;
      auVar169._4_4_ = auVar169._0_4_;
      auVar169._8_4_ = auVar169._0_4_;
      auVar169._12_4_ = auVar169._0_4_;
      auVar169._20_4_ = fVar147;
      auVar169._16_4_ = fVar147;
      auVar169._24_4_ = fVar147;
      auVar169._28_4_ = fVar147;
      auVar72 = vsubps_avx(auVar116,auVar107);
      auVar65 = vfmadd213ps_fma(auVar72,auVar169,auVar107);
      auVar72 = vsubps_avx(auVar132,auVar116);
      auVar74 = vfmadd213ps_fma(auVar72,auVar169,auVar116);
      auVar272 = vsubps_avx(auVar66,auVar97);
      auVar117._16_16_ = auVar272;
      auVar117._0_16_ = auVar272;
      auVar272 = vfmadd213ps_fma(auVar117,auVar169,auVar132);
      auVar72 = vsubps_avx(ZEXT1632(auVar74),ZEXT1632(auVar65));
      auVar66 = vfmadd213ps_fma(auVar72,auVar169,ZEXT1632(auVar65));
      auVar72 = vsubps_avx(ZEXT1632(auVar272),ZEXT1632(auVar74));
      auVar272 = vfmadd213ps_fma(auVar72,auVar169,ZEXT1632(auVar74));
      auVar72 = vsubps_avx(ZEXT1632(auVar272),ZEXT1632(auVar66));
      auVar108 = vfmadd231ps_fma(ZEXT1632(auVar66),auVar72,auVar169);
      fVar171 = auVar72._4_4_ * 3.0;
      fVar64 = fVar133 * 0.33333334;
      auVar223._0_8_ =
           CONCAT44(auVar108._4_4_ + fVar64 * fVar171,auVar108._0_4_ + fVar64 * auVar72._0_4_ * 3.0)
      ;
      auVar223._8_4_ = auVar108._8_4_ + fVar64 * auVar72._8_4_ * 3.0;
      auVar223._12_4_ = auVar108._12_4_ + fVar64 * auVar72._12_4_ * 3.0;
      auVar66 = vshufpd_avx(auVar108,auVar108,3);
      auVar65 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      auVar272 = vsubps_avx(auVar66,auVar108);
      auVar97 = vsubps_avx(auVar65,(undefined1  [16])0x0);
      auVar100._0_4_ = auVar272._0_4_ + auVar97._0_4_;
      auVar100._4_4_ = auVar272._4_4_ + auVar97._4_4_;
      auVar100._8_4_ = auVar272._8_4_ + auVar97._8_4_;
      auVar100._12_4_ = auVar272._12_4_ + auVar97._12_4_;
      auVar272 = vshufps_avx(auVar108,auVar108,0xb1);
      auVar97 = vshufps_avx(auVar223,auVar223,0xb1);
      auVar258._4_4_ = auVar100._0_4_;
      auVar258._0_4_ = auVar100._0_4_;
      auVar258._8_4_ = auVar100._0_4_;
      auVar258._12_4_ = auVar100._0_4_;
      auVar74 = vshufps_avx(auVar100,auVar100,0x55);
      fVar148 = auVar74._0_4_;
      auVar183._0_4_ = auVar272._0_4_ * fVar148;
      fVar149 = auVar74._4_4_;
      auVar183._4_4_ = auVar272._4_4_ * fVar149;
      fVar95 = auVar74._8_4_;
      auVar183._8_4_ = auVar272._8_4_ * fVar95;
      fVar96 = auVar74._12_4_;
      auVar183._12_4_ = auVar272._12_4_ * fVar96;
      auVar198._0_4_ = auVar97._0_4_ * fVar148;
      auVar198._4_4_ = auVar97._4_4_ * fVar149;
      auVar198._8_4_ = auVar97._8_4_ * fVar95;
      auVar198._12_4_ = auVar97._12_4_ * fVar96;
      auVar200 = vfmadd231ps_fma(auVar183,auVar258,auVar108);
      local_3d8._0_16_ = auVar223;
      auVar75 = vfmadd231ps_fma(auVar198,auVar258,auVar223);
      auVar97 = vshufps_avx(auVar200,auVar200,0xe8);
      auVar74 = vshufps_avx(auVar75,auVar75,0xe8);
      auVar272 = vcmpps_avx(auVar97,auVar74,1);
      uVar53 = vextractps_avx(auVar272,0);
      auVar119 = auVar75;
      if ((uVar53 & 1) == 0) {
        auVar119 = auVar200;
      }
      auVar122._0_4_ = fVar64 * auVar72._16_4_ * 3.0;
      auVar122._4_4_ = fVar64 * fVar171;
      auVar122._8_4_ = fVar64 * auVar72._24_4_ * 3.0;
      auVar122._12_4_ = fVar64 * fVar147;
      auVar134 = vsubps_avx((undefined1  [16])0x0,auVar122);
      auVar123 = vshufps_avx(auVar134,auVar134,0xb1);
      auVar73 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar278._0_4_ = auVar123._0_4_ * fVar148;
      auVar278._4_4_ = auVar123._4_4_ * fVar149;
      auVar278._8_4_ = auVar123._8_4_ * fVar95;
      auVar278._12_4_ = auVar123._12_4_ * fVar96;
      auVar101._0_4_ = auVar73._0_4_ * fVar148;
      auVar101._4_4_ = auVar73._4_4_ * fVar149;
      auVar101._8_4_ = auVar73._8_4_ * fVar95;
      auVar101._12_4_ = auVar73._12_4_ * fVar96;
      auVar135 = vfmadd231ps_fma(auVar278,auVar258,auVar134);
      auVar136 = vfmadd231ps_fma(auVar101,(undefined1  [16])0x0,auVar258);
      auVar73 = vshufps_avx(auVar135,auVar135,0xe8);
      auVar118 = vshufps_avx(auVar136,auVar136,0xe8);
      auVar123 = vcmpps_avx(auVar73,auVar118,1);
      uVar53 = vextractps_avx(auVar123,0);
      auVar179 = auVar136;
      if ((uVar53 & 1) == 0) {
        auVar179 = auVar135;
      }
      auVar119 = vmaxss_avx(auVar179,auVar119);
      auVar97 = vminps_avx(auVar97,auVar74);
      auVar74 = vminps_avx(auVar73,auVar118);
      auVar74 = vminps_avx(auVar97,auVar74);
      auVar272 = vshufps_avx(auVar272,auVar272,0x55);
      auVar272 = vblendps_avx(auVar272,auVar123,2);
      auVar123 = vpslld_avx(auVar272,0x1f);
      auVar272 = vshufpd_avx(auVar75,auVar75,1);
      auVar272 = vinsertps_avx(auVar272,auVar136,0x9c);
      auVar97 = vshufpd_avx(auVar200,auVar200,1);
      auVar97 = vinsertps_avx(auVar97,auVar135,0x9c);
      auVar272 = vblendvps_avx(auVar97,auVar272,auVar123);
      auVar97 = vmovshdup_avx(auVar272);
      auVar272 = vmaxss_avx(auVar97,auVar272);
      fVar95 = auVar74._0_4_;
      auVar97 = vmovshdup_avx(auVar74);
      fVar149 = auVar272._0_4_;
      fVar148 = auVar119._0_4_;
      if ((0.0001 <= fVar95) || (fVar149 <= -0.0001)) {
        auVar200 = vcmpps_avx(auVar97,SUB6416(ZEXT464(0x38d1b717),0),1);
        auVar75 = vcmpps_avx(auVar74,SUB6416(ZEXT464(0x38d1b717),0),1);
        auVar200 = vorps_avx(auVar75,auVar200);
        if ((-0.0001 < fVar148 & auVar200[0]) != 0) goto LAB_016aacad;
        auVar200 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar272,5);
        auVar75 = vcmpps_avx(auVar97,SUB6416(ZEXT464(0x38d1b717),0),5);
        auVar200 = vorps_avx(auVar75,auVar200);
        if ((auVar200 & (undefined1  [16])0x1) == (undefined1  [16])0x0) goto LAB_016aacad;
LAB_016ab672:
        bVar42 = true;
      }
      else {
LAB_016aacad:
        auVar75 = vcmpps_avx(auVar74,_DAT_01feba10,1);
        auVar123 = SUB6416(ZEXT864(0),0) << 0x20;
        auVar200 = vcmpss_avx(auVar119,ZEXT816(0) << 0x20,1);
        auVar141._8_4_ = 0x3f800000;
        auVar141._0_8_ = &DAT_3f8000003f800000;
        auVar141._12_4_ = 0x3f800000;
        auVar199._8_4_ = 0xbf800000;
        auVar199._0_8_ = 0xbf800000bf800000;
        auVar199._12_4_ = 0xbf800000;
        auVar200 = vblendvps_avx(auVar141,auVar199,auVar200);
        auVar75 = vblendvps_avx(auVar141,auVar199,auVar75);
        fVar96 = auVar75._0_4_;
        fVar64 = auVar200._0_4_;
        auVar200 = SUB6416(ZEXT864(0),0) << 0x20;
        if ((fVar96 == fVar64) && (!NAN(fVar96) && !NAN(fVar64))) {
          auVar200 = SUB6416(ZEXT464(0x7f800000),0);
        }
        auVar73 = ZEXT816(0) << 0x20;
        if ((fVar96 == fVar64) && (!NAN(fVar96) && !NAN(fVar64))) {
          auVar123 = SUB6416(ZEXT464(0xff800000),0);
        }
        auVar75 = vmovshdup_avx(auVar75);
        fVar171 = auVar75._0_4_;
        if ((fVar96 != fVar171) || (NAN(fVar96) || NAN(fVar171))) {
          fVar96 = auVar97._0_4_;
          if ((fVar96 != fVar95) || (NAN(fVar96) || NAN(fVar95))) {
            auVar102._0_8_ = auVar74._0_8_ ^ 0x8000000080000000;
            auVar102._8_4_ = auVar74._8_4_ ^ 0x80000000;
            auVar102._12_4_ = auVar74._12_4_ ^ 0x80000000;
            auVar124._0_4_ = -fVar95 / (fVar96 - fVar95);
            auVar124._4_12_ = auVar102._4_12_;
            auVar97 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar124._0_4_)),auVar73,auVar124);
            auVar74 = auVar97;
          }
          else {
            auVar97 = SUB6416(ZEXT464(0x7f800000),0);
            if ((fVar95 == 0.0) && (auVar97 = SUB6416(ZEXT464(0x7f800000),0), !NAN(fVar95))) {
              auVar97 = ZEXT816(0);
            }
            auVar74 = SUB6416(ZEXT464(0xff800000),0);
            if ((fVar95 == 0.0) && (auVar74 = SUB6416(ZEXT464(0xff800000),0), !NAN(fVar95))) {
              auVar74 = SUB6416(ZEXT464(0x3f800000),0);
            }
          }
          auVar200 = vminss_avx(auVar200,auVar97);
          auVar123 = vmaxss_avx(auVar74,auVar123);
        }
        auVar272 = vcmpss_avx(auVar272,auVar73,1);
        auVar125._8_4_ = 0x3f800000;
        auVar125._0_8_ = &DAT_3f8000003f800000;
        auVar125._12_4_ = 0x3f800000;
        auVar142._8_4_ = 0xbf800000;
        auVar142._0_8_ = 0xbf800000bf800000;
        auVar142._12_4_ = 0xbf800000;
        auVar272 = vblendvps_avx(auVar125,auVar142,auVar272);
        fVar95 = auVar272._0_4_;
        auVar272 = SUB6416(ZEXT464(0x3f800000),0);
        if ((fVar64 != fVar95) || (NAN(fVar64) || NAN(fVar95))) {
          if ((fVar149 != fVar148) || (NAN(fVar149) || NAN(fVar148))) {
            auVar103._0_8_ = auVar119._0_8_ ^ 0x8000000080000000;
            auVar103._8_4_ = auVar119._8_4_ ^ 0x80000000;
            auVar103._12_4_ = auVar119._12_4_ ^ 0x80000000;
            auVar126._0_4_ = -fVar148 / (fVar149 - fVar148);
            auVar126._4_12_ = auVar103._4_12_;
            auVar97 = vfmadd213ss_fma(ZEXT416((uint)(1.0 - auVar126._0_4_)),auVar73,auVar126);
            auVar74 = auVar97;
          }
          else {
            auVar97 = SUB6416(ZEXT464(0x7f800000),0);
            if ((fVar148 == 0.0) && (auVar97 = SUB6416(ZEXT464(0x7f800000),0), !NAN(fVar148))) {
              auVar97 = ZEXT816(0);
            }
            auVar74 = SUB6416(ZEXT464(0xff800000),0);
            if ((fVar148 == 0.0) && (auVar74 = SUB6416(ZEXT464(0xff800000),0), !NAN(fVar148))) {
              auVar74 = auVar272;
            }
          }
          auVar200 = vminss_avx(auVar200,auVar97);
          auVar123 = vmaxss_avx(auVar74,auVar123);
        }
        if ((fVar171 != fVar95) || (NAN(fVar171) || NAN(fVar95))) {
          auVar200 = vminss_avx(auVar200,auVar272);
          auVar123 = vmaxss_avx(auVar272,auVar123);
        }
        auVar97 = vmaxss_avx(auVar73,auVar200);
        auVar74 = vminss_avx(auVar123,auVar272);
        bVar42 = true;
        if (auVar97._0_4_ <= auVar74._0_4_) {
          auVar97 = vmaxss_avx(auVar73,ZEXT416((uint)(auVar97._0_4_ + -0.1)));
          auVar272 = vminss_avx(ZEXT416((uint)(auVar74._0_4_ + 0.1)),auVar272);
          auVar85._0_8_ = auVar108._0_8_;
          auVar85._8_8_ = auVar85._0_8_;
          auVar201._8_8_ = auVar223._0_8_;
          auVar201._0_8_ = auVar223._0_8_;
          auVar215._8_8_ = auVar134._0_8_;
          auVar215._0_8_ = auVar134._0_8_;
          auVar74 = vshufpd_avx(auVar223,auVar223,3);
          auVar200 = vshufpd_avx(auVar134,auVar134,3);
          auVar75 = vshufps_avx(auVar97,auVar272,0);
          auVar111._8_4_ = 0x3f800000;
          auVar111._0_8_ = &DAT_3f8000003f800000;
          auVar111._12_4_ = 0x3f800000;
          auVar108 = vsubps_avx(auVar111,auVar75);
          local_628._0_4_ = auVar66._0_4_;
          local_628._4_4_ = auVar66._4_4_;
          fStack_620 = auVar66._8_4_;
          fStack_61c = auVar66._12_4_;
          fVar148 = auVar75._0_4_;
          auVar112._0_4_ = fVar148 * (float)local_628._0_4_;
          fVar149 = auVar75._4_4_;
          auVar112._4_4_ = fVar149 * (float)local_628._4_4_;
          fVar95 = auVar75._8_4_;
          auVar112._8_4_ = fVar95 * fStack_620;
          fVar96 = auVar75._12_4_;
          auVar112._12_4_ = fVar96 * fStack_61c;
          auVar127._0_4_ = auVar74._0_4_ * fVar148;
          auVar127._4_4_ = auVar74._4_4_ * fVar149;
          auVar127._8_4_ = auVar74._8_4_ * fVar95;
          auVar127._12_4_ = auVar74._12_4_ * fVar96;
          auVar143._0_4_ = auVar200._0_4_ * fVar148;
          auVar143._4_4_ = auVar200._4_4_ * fVar149;
          auVar143._8_4_ = auVar200._8_4_ * fVar95;
          auVar143._12_4_ = auVar200._12_4_ * fVar96;
          local_5a8._0_4_ = auVar65._0_4_;
          local_5a8._4_4_ = auVar65._4_4_;
          uStack_5a0._0_4_ = auVar65._8_4_;
          uStack_5a0._4_4_ = auVar65._12_4_;
          auVar164._0_4_ = fVar148 * (float)local_5a8._0_4_;
          auVar164._4_4_ = fVar149 * (float)local_5a8._4_4_;
          auVar164._8_4_ = fVar95 * (float)uStack_5a0;
          auVar164._12_4_ = fVar96 * uStack_5a0._4_4_;
          auVar74 = vfmadd231ps_fma(auVar112,auVar108,auVar85);
          auVar200 = vfmadd231ps_fma(auVar127,auVar108,auVar201);
          auVar75 = vfmadd231ps_fma(auVar143,auVar108,auVar215);
          auVar108 = vfmadd231ps_fma(auVar164,auVar108,ZEXT816(0));
          auVar66 = vmovshdup_avx(_local_668);
          auVar73 = vfmadd231ss_fma(ZEXT416((uint)(auVar66._0_4_ * auVar97._0_4_)),_local_668,
                                    ZEXT416((uint)(1.0 - auVar97._0_4_)));
          auVar118 = vfmadd231ss_fma(ZEXT416((uint)(auVar66._0_4_ * auVar272._0_4_)),_local_668,
                                     ZEXT416((uint)(1.0 - auVar272._0_4_)));
          fVar148 = 1.0 / fVar133;
          auVar272 = vsubps_avx(auVar200,auVar74);
          auVar184._0_4_ = auVar272._0_4_ * 3.0;
          auVar184._4_4_ = auVar272._4_4_ * 3.0;
          auVar184._8_4_ = auVar272._8_4_ * 3.0;
          auVar184._12_4_ = auVar272._12_4_ * 3.0;
          auVar272 = vsubps_avx(auVar75,auVar200);
          auVar202._0_4_ = auVar272._0_4_ * 3.0;
          auVar202._4_4_ = auVar272._4_4_ * 3.0;
          auVar202._8_4_ = auVar272._8_4_ * 3.0;
          auVar202._12_4_ = auVar272._12_4_ * 3.0;
          auVar272 = vsubps_avx(auVar108,auVar75);
          auVar216._0_4_ = auVar272._0_4_ * 3.0;
          auVar216._4_4_ = auVar272._4_4_ * 3.0;
          auVar216._8_4_ = auVar272._8_4_ * 3.0;
          auVar216._12_4_ = auVar272._12_4_ * 3.0;
          auVar66 = vminps_avx(auVar202,auVar216);
          auVar272 = vmaxps_avx(auVar202,auVar216);
          auVar66 = vminps_avx(auVar184,auVar66);
          auVar272 = vmaxps_avx(auVar184,auVar272);
          auVar65 = vshufpd_avx(auVar66,auVar66,3);
          auVar97 = vshufpd_avx(auVar272,auVar272,3);
          auVar66 = vminps_avx(auVar66,auVar65);
          auVar272 = vmaxps_avx(auVar272,auVar97);
          auVar203._0_4_ = auVar66._0_4_ * fVar148;
          auVar203._4_4_ = auVar66._4_4_ * fVar148;
          auVar203._8_4_ = auVar66._8_4_ * fVar148;
          auVar203._12_4_ = auVar66._12_4_ * fVar148;
          auVar185._0_4_ = fVar148 * auVar272._0_4_;
          auVar185._4_4_ = fVar148 * auVar272._4_4_;
          auVar185._8_4_ = fVar148 * auVar272._8_4_;
          auVar185._12_4_ = fVar148 * auVar272._12_4_;
          fVar148 = 1.0 / (auVar118._0_4_ - auVar73._0_4_);
          auVar272 = vshufpd_avx(auVar74,auVar74,3);
          auVar66 = vshufpd_avx(auVar200,auVar200,3);
          auVar65 = vshufpd_avx(auVar75,auVar75,3);
          auVar97 = vshufpd_avx(auVar108,auVar108,3);
          auVar272 = vsubps_avx(auVar272,auVar74);
          auVar74 = vsubps_avx(auVar66,auVar200);
          auVar200 = vsubps_avx(auVar65,auVar75);
          auVar97 = vsubps_avx(auVar97,auVar108);
          auVar66 = vminps_avx(auVar272,auVar74);
          auVar272 = vmaxps_avx(auVar272,auVar74);
          auVar65 = vminps_avx(auVar200,auVar97);
          auVar65 = vminps_avx(auVar66,auVar65);
          auVar66 = vmaxps_avx(auVar200,auVar97);
          auVar272 = vmaxps_avx(auVar272,auVar66);
          auVar238._0_4_ = fVar148 * auVar65._0_4_;
          auVar238._4_4_ = fVar148 * auVar65._4_4_;
          auVar238._8_4_ = fVar148 * auVar65._8_4_;
          auVar238._12_4_ = fVar148 * auVar65._12_4_;
          auVar224._0_4_ = fVar148 * auVar272._0_4_;
          auVar224._4_4_ = fVar148 * auVar272._4_4_;
          auVar224._8_4_ = fVar148 * auVar272._8_4_;
          auVar224._12_4_ = fVar148 * auVar272._12_4_;
          auVar97 = vinsertps_avx(auVar8,auVar73,0x10);
          auVar74 = vinsertps_avx(auVar70,auVar118,0x10);
          auVar69._0_4_ = (auVar97._0_4_ + auVar74._0_4_) * 0.5;
          auVar69._4_4_ = (auVar97._4_4_ + auVar74._4_4_) * 0.5;
          auVar69._8_4_ = (auVar97._8_4_ + auVar74._8_4_) * 0.5;
          auVar69._12_4_ = (auVar97._12_4_ + auVar74._12_4_) * 0.5;
          auVar113._4_4_ = auVar69._0_4_;
          auVar113._0_4_ = auVar69._0_4_;
          auVar113._8_4_ = auVar69._0_4_;
          auVar113._12_4_ = auVar69._0_4_;
          auVar272 = vfmadd213ps_fma(local_298,auVar113,auVar9);
          auVar66 = vfmadd213ps_fma(local_2a8,auVar113,auVar10);
          auVar65 = vfmadd213ps_fma(local_2b8,auVar113,auVar11);
          auVar70 = vsubps_avx(auVar66,auVar272);
          auVar272 = vfmadd213ps_fma(auVar70,auVar113,auVar272);
          auVar70 = vsubps_avx(auVar65,auVar66);
          auVar70 = vfmadd213ps_fma(auVar70,auVar113,auVar66);
          auVar70 = vsubps_avx(auVar70,auVar272);
          auVar272 = vfmadd231ps_fma(auVar272,auVar70,auVar113);
          auVar114._0_8_ = CONCAT44(auVar70._4_4_ * 3.0,auVar70._0_4_ * 3.0);
          auVar114._8_4_ = auVar70._8_4_ * 3.0;
          auVar114._12_4_ = auVar70._12_4_ * 3.0;
          auVar217._8_8_ = auVar272._0_8_;
          auVar217._0_8_ = auVar272._0_8_;
          auVar70 = vshufpd_avx(auVar272,auVar272,3);
          auVar272 = vshufps_avx(auVar69,auVar69,0x55);
          auVar200 = vsubps_avx(auVar70,auVar217);
          auVar108 = vfmadd231ps_fma(auVar217,auVar272,auVar200);
          auVar259._8_8_ = auVar114._0_8_;
          auVar259._0_8_ = auVar114._0_8_;
          auVar70 = vshufpd_avx(auVar114,auVar114,3);
          auVar70 = vsubps_avx(auVar70,auVar259);
          auVar75 = vfmadd213ps_fma(auVar70,auVar272,auVar259);
          auVar272 = vmovshdup_avx(auVar75);
          auVar260._0_8_ = auVar272._0_8_ ^ 0x8000000080000000;
          auVar260._8_4_ = auVar272._8_4_ ^ 0x80000000;
          auVar260._12_4_ = auVar272._12_4_ ^ 0x80000000;
          auVar66 = vmovshdup_avx(auVar200);
          auVar70 = vunpcklps_avx(auVar66,auVar260);
          auVar65 = vshufps_avx(auVar70,auVar260,4);
          auVar279._0_8_ = auVar200._0_8_ ^ 0x8000000080000000;
          auVar279._8_4_ = auVar200._8_4_ ^ 0x80000000;
          auVar279._12_4_ = auVar200._12_4_ ^ 0x80000000;
          auVar70 = vmovlhps_avx(auVar279,auVar75);
          auVar70 = vshufps_avx(auVar70,auVar75,8);
          auVar272 = vfmsub231ss_fma(ZEXT416((uint)(auVar272._0_4_ * auVar200._0_4_)),auVar66,
                                     auVar75);
          auVar128._0_4_ = auVar272._0_4_;
          auVar128._4_4_ = auVar128._0_4_;
          auVar128._8_4_ = auVar128._0_4_;
          auVar128._12_4_ = auVar128._0_4_;
          auVar272 = vdivps_avx(auVar65,auVar128);
          auVar66 = vdivps_avx(auVar70,auVar128);
          fVar95 = auVar108._0_4_;
          fVar148 = auVar272._0_4_;
          auVar70 = vshufps_avx(auVar108,auVar108,0x55);
          fVar149 = auVar66._0_4_;
          local_5a8._4_4_ = fVar95 * auVar272._4_4_ + auVar70._4_4_ * auVar66._4_4_;
          local_5a8._0_4_ = fVar95 * fVar148 + auVar70._0_4_ * fVar149;
          uStack_5a0._0_4_ = fVar95 * auVar272._8_4_ + auVar70._8_4_ * auVar66._8_4_;
          uStack_5a0._4_4_ = fVar95 * auVar272._12_4_ + auVar70._12_4_ * auVar66._12_4_;
          auVar200 = vmovshdup_avx(auVar272);
          auVar70 = vinsertps_avx(auVar203,auVar238,0x1c);
          auVar273._0_4_ = auVar200._0_4_ * auVar70._0_4_;
          auVar273._4_4_ = auVar200._4_4_ * auVar70._4_4_;
          auVar273._8_4_ = auVar200._8_4_ * auVar70._8_4_;
          auVar273._12_4_ = auVar200._12_4_ * auVar70._12_4_;
          auVar65 = vinsertps_avx(auVar185,auVar224,0x1c);
          auVar246._0_4_ = auVar200._0_4_ * auVar65._0_4_;
          auVar246._4_4_ = auVar200._4_4_ * auVar65._4_4_;
          auVar246._8_4_ = auVar200._8_4_ * auVar65._8_4_;
          auVar246._12_4_ = auVar200._12_4_ * auVar65._12_4_;
          auVar119 = vminps_avx(auVar273,auVar246);
          auVar108 = vmaxps_avx(auVar246,auVar273);
          auVar200 = vinsertps_avx(auVar238,auVar203,0x4c);
          auVar123 = vmovshdup_avx(auVar66);
          auVar75 = vinsertps_avx(auVar224,auVar185,0x4c);
          auVar225._0_4_ = auVar123._0_4_ * auVar200._0_4_;
          auVar225._4_4_ = auVar123._4_4_ * auVar200._4_4_;
          auVar225._8_4_ = auVar123._8_4_ * auVar200._8_4_;
          auVar225._12_4_ = auVar123._12_4_ * auVar200._12_4_;
          auVar239._0_4_ = auVar123._0_4_ * auVar75._0_4_;
          auVar239._4_4_ = auVar123._4_4_ * auVar75._4_4_;
          auVar239._8_4_ = auVar123._8_4_ * auVar75._8_4_;
          auVar239._12_4_ = auVar123._12_4_ * auVar75._12_4_;
          auVar123 = vminps_avx(auVar225,auVar239);
          auVar86._0_4_ = auVar123._0_4_ + auVar119._0_4_;
          auVar86._4_4_ = auVar123._4_4_ + auVar119._4_4_;
          auVar86._8_4_ = auVar123._8_4_ + auVar119._8_4_;
          auVar86._12_4_ = auVar123._12_4_ + auVar119._12_4_;
          auVar119 = vmaxps_avx(auVar239,auVar225);
          auVar226._0_4_ = auVar108._0_4_ + auVar119._0_4_;
          auVar226._4_4_ = auVar108._4_4_ + auVar119._4_4_;
          auVar226._8_4_ = auVar108._8_4_ + auVar119._8_4_;
          auVar226._12_4_ = auVar108._12_4_ + auVar119._12_4_;
          auVar240._8_8_ = 0x3f80000000000000;
          auVar240._0_8_ = 0x3f80000000000000;
          auVar108 = vsubps_avx(auVar240,auVar226);
          auVar119 = vsubps_avx(auVar240,auVar86);
          auVar123 = vsubps_avx(auVar97,auVar69);
          auVar261._0_4_ = fVar148 * auVar70._0_4_;
          auVar261._4_4_ = fVar148 * auVar70._4_4_;
          auVar261._8_4_ = fVar148 * auVar70._8_4_;
          auVar261._12_4_ = fVar148 * auVar70._12_4_;
          auVar247._0_4_ = fVar148 * auVar65._0_4_;
          auVar247._4_4_ = fVar148 * auVar65._4_4_;
          auVar247._8_4_ = fVar148 * auVar65._8_4_;
          auVar247._12_4_ = fVar148 * auVar65._12_4_;
          auVar65 = vminps_avx(auVar261,auVar247);
          auVar70 = vmaxps_avx(auVar247,auVar261);
          auVar204._0_4_ = fVar149 * auVar200._0_4_;
          auVar204._4_4_ = fVar149 * auVar200._4_4_;
          auVar204._8_4_ = fVar149 * auVar200._8_4_;
          auVar204._12_4_ = fVar149 * auVar200._12_4_;
          auVar186._0_4_ = fVar149 * auVar75._0_4_;
          auVar186._4_4_ = fVar149 * auVar75._4_4_;
          auVar186._8_4_ = fVar149 * auVar75._8_4_;
          auVar186._12_4_ = fVar149 * auVar75._12_4_;
          auVar200 = vminps_avx(auVar204,auVar186);
          auVar262._0_4_ = auVar65._0_4_ + auVar200._0_4_;
          auVar262._4_4_ = auVar65._4_4_ + auVar200._4_4_;
          auVar262._8_4_ = auVar65._8_4_ + auVar200._8_4_;
          auVar262._12_4_ = auVar65._12_4_ + auVar200._12_4_;
          auVar200 = vsubps_avx(auVar74,auVar69);
          auVar65 = vmaxps_avx(auVar186,auVar204);
          fVar95 = auVar123._0_4_;
          auVar205._0_4_ = fVar95 * auVar108._0_4_;
          fVar96 = auVar123._4_4_;
          auVar205._4_4_ = fVar96 * auVar108._4_4_;
          fVar64 = auVar123._8_4_;
          auVar205._8_4_ = fVar64 * auVar108._8_4_;
          fVar171 = auVar123._12_4_;
          auVar205._12_4_ = fVar171 * auVar108._12_4_;
          auVar187._0_4_ = auVar70._0_4_ + auVar65._0_4_;
          auVar187._4_4_ = auVar70._4_4_ + auVar65._4_4_;
          auVar187._8_4_ = auVar70._8_4_ + auVar65._8_4_;
          auVar187._12_4_ = auVar70._12_4_ + auVar65._12_4_;
          auVar248._8_8_ = 0x3f800000;
          auVar248._0_8_ = 0x3f800000;
          auVar70 = vsubps_avx(auVar248,auVar187);
          auVar65 = vsubps_avx(auVar248,auVar262);
          auVar263._0_4_ = fVar95 * auVar119._0_4_;
          auVar263._4_4_ = fVar96 * auVar119._4_4_;
          auVar263._8_4_ = fVar64 * auVar119._8_4_;
          auVar263._12_4_ = fVar171 * auVar119._12_4_;
          fVar150 = auVar200._0_4_;
          auVar227._0_4_ = fVar150 * auVar108._0_4_;
          fVar151 = auVar200._4_4_;
          auVar227._4_4_ = fVar151 * auVar108._4_4_;
          fVar152 = auVar200._8_4_;
          auVar227._8_4_ = fVar152 * auVar108._8_4_;
          fVar244 = auVar200._12_4_;
          auVar227._12_4_ = fVar244 * auVar108._12_4_;
          auVar87._0_4_ = fVar150 * auVar119._0_4_;
          auVar87._4_4_ = fVar151 * auVar119._4_4_;
          auVar87._8_4_ = fVar152 * auVar119._8_4_;
          auVar87._12_4_ = fVar244 * auVar119._12_4_;
          auVar280._0_4_ = fVar95 * auVar70._0_4_;
          auVar280._4_4_ = fVar96 * auVar70._4_4_;
          auVar280._8_4_ = fVar64 * auVar70._8_4_;
          auVar280._12_4_ = fVar171 * auVar70._12_4_;
          auVar241._0_4_ = fVar95 * auVar65._0_4_;
          auVar241._4_4_ = fVar96 * auVar65._4_4_;
          auVar241._8_4_ = fVar64 * auVar65._8_4_;
          auVar241._12_4_ = fVar171 * auVar65._12_4_;
          auVar188._0_4_ = fVar150 * auVar70._0_4_;
          auVar188._4_4_ = fVar151 * auVar70._4_4_;
          auVar188._8_4_ = fVar152 * auVar70._8_4_;
          auVar188._12_4_ = fVar244 * auVar70._12_4_;
          auVar249._0_4_ = fVar150 * auVar65._0_4_;
          auVar249._4_4_ = fVar151 * auVar65._4_4_;
          auVar249._8_4_ = fVar152 * auVar65._8_4_;
          auVar249._12_4_ = fVar244 * auVar65._12_4_;
          auVar70 = vminps_avx(auVar280,auVar241);
          auVar65 = vminps_avx(auVar188,auVar249);
          auVar70 = vminps_avx(auVar70,auVar65);
          auVar65 = vmaxps_avx(auVar241,auVar280);
          auVar200 = vminps_avx(auVar205,auVar263);
          auVar75 = vminps_avx(auVar227,auVar87);
          auVar200 = vminps_avx(auVar200,auVar75);
          auVar70 = vhaddps_avx(auVar70,auVar200);
          auVar200 = vmaxps_avx(auVar249,auVar188);
          auVar65 = vmaxps_avx(auVar200,auVar65);
          auVar200 = vmaxps_avx(auVar263,auVar205);
          auVar75 = vmaxps_avx(auVar87,auVar227);
          auVar200 = vmaxps_avx(auVar75,auVar200);
          auVar65 = vhaddps_avx(auVar65,auVar200);
          auVar200 = vshufps_avx(auVar69,auVar69,0x54);
          auVar200 = vsubps_avx(auVar200,_local_5a8);
          auVar70 = vshufps_avx(auVar70,auVar70,0xe8);
          auVar65 = vshufps_avx(auVar65,auVar65,0xe8);
          auVar206._0_4_ = auVar200._0_4_ + auVar70._0_4_;
          auVar206._4_4_ = auVar200._4_4_ + auVar70._4_4_;
          auVar206._8_4_ = auVar200._8_4_ + auVar70._8_4_;
          auVar206._12_4_ = auVar200._12_4_ + auVar70._12_4_;
          auVar189._0_4_ = auVar200._0_4_ + auVar65._0_4_;
          auVar189._4_4_ = auVar200._4_4_ + auVar65._4_4_;
          auVar189._8_4_ = auVar200._8_4_ + auVar65._8_4_;
          auVar189._12_4_ = auVar200._12_4_ + auVar65._12_4_;
          auVar70 = vmaxps_avx(auVar97,auVar206);
          auVar65 = vminps_avx(auVar189,auVar74);
          auVar70 = vcmpps_avx(auVar65,auVar70,1);
          auVar70 = vshufps_avx(auVar70,auVar70,0x50);
          _local_668 = vinsertps_avx(auVar73,ZEXT416((uint)auVar118._0_4_),0x10);
          if ((auVar70 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
              auVar70[0xf] < '\0') goto LAB_016ab672;
          bVar59 = 0;
          if ((auVar169._0_4_ < auVar206._0_4_) && (bVar59 = 0, auVar189._0_4_ < auVar74._0_4_)) {
            auVar65 = vmovshdup_avx(auVar206);
            auVar70 = vcmpps_avx(auVar189,auVar74,1);
            bVar59 = auVar70[4] & auVar73._0_4_ < auVar65._0_4_;
          }
          if (((3 < (uint)uVar56 || fVar133 < 0.001) | bVar59) == 1) {
            lVar58 = 200;
            do {
              fVar64 = auVar200._0_4_;
              fVar96 = 1.0 - fVar64;
              fVar133 = fVar96 * fVar96 * fVar96;
              fVar95 = fVar64 * 3.0 * fVar96 * fVar96;
              fVar96 = fVar96 * fVar64 * fVar64 * 3.0;
              auVar144._4_4_ = fVar133;
              auVar144._0_4_ = fVar133;
              auVar144._8_4_ = fVar133;
              auVar144._12_4_ = fVar133;
              auVar104._4_4_ = fVar95;
              auVar104._0_4_ = fVar95;
              auVar104._8_4_ = fVar95;
              auVar104._12_4_ = fVar95;
              auVar88._4_4_ = fVar96;
              auVar88._0_4_ = fVar96;
              auVar88._8_4_ = fVar96;
              auVar88._12_4_ = fVar96;
              fVar64 = fVar64 * fVar64 * fVar64;
              auVar165._0_4_ = (float)local_468._0_4_ * fVar64;
              auVar165._4_4_ = (float)local_468._4_4_ * fVar64;
              auVar165._8_4_ = fStack_460 * fVar64;
              auVar165._12_4_ = fStack_45c * fVar64;
              auVar70 = vfmadd231ps_fma(auVar165,auVar11,auVar88);
              auVar70 = vfmadd231ps_fma(auVar70,auVar10,auVar104);
              auVar70 = vfmadd231ps_fma(auVar70,auVar9,auVar144);
              auVar89._8_8_ = auVar70._0_8_;
              auVar89._0_8_ = auVar70._0_8_;
              auVar70 = vshufpd_avx(auVar70,auVar70,3);
              auVar65 = vshufps_avx(auVar200,auVar200,0x55);
              auVar70 = vsubps_avx(auVar70,auVar89);
              auVar65 = vfmadd213ps_fma(auVar70,auVar65,auVar89);
              fVar133 = auVar65._0_4_;
              auVar70 = vshufps_avx(auVar65,auVar65,0x55);
              auVar90._0_4_ = fVar148 * fVar133 + fVar149 * auVar70._0_4_;
              auVar90._4_4_ = auVar272._4_4_ * fVar133 + auVar66._4_4_ * auVar70._4_4_;
              auVar90._8_4_ = auVar272._8_4_ * fVar133 + auVar66._8_4_ * auVar70._8_4_;
              auVar90._12_4_ = auVar272._12_4_ * fVar133 + auVar66._12_4_ * auVar70._12_4_;
              auVar200 = vsubps_avx(auVar200,auVar90);
              auVar70 = vandps_avx(auVar277,auVar65);
              auVar65 = vshufps_avx(auVar70,auVar70,0xf5);
              auVar70 = vmaxss_avx(auVar65,auVar70);
              if (auVar70._0_4_ < (float)local_2c8._0_4_) {
                local_218 = auVar200._0_4_;
                if ((0.0 <= local_218) && (local_218 <= 1.0)) {
                  auVar70 = vmovshdup_avx(auVar200);
                  fVar133 = auVar70._0_4_;
                  if ((0.0 <= fVar133) && (fVar133 <= 1.0)) {
                    auVar70 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                            ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c
                                           );
                    auVar108 = vinsertps_avx(auVar70,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128
                                                                   [2]),0x28);
                    auVar70 = vdpps_avx(auVar108,local_478,0x7f);
                    auVar272 = vdpps_avx(auVar108,local_488,0x7f);
                    auVar66 = vdpps_avx(auVar108,local_2d8,0x7f);
                    auVar65 = vdpps_avx(auVar108,local_2e8,0x7f);
                    auVar97 = vdpps_avx(auVar108,local_2f8,0x7f);
                    auVar74 = vdpps_avx(auVar108,local_308,0x7f);
                    auVar75 = vdpps_avx(auVar108,local_318,0x7f);
                    auVar108 = vdpps_avx(auVar108,local_328,0x7f);
                    fVar148 = 1.0 - fVar133;
                    auVar70 = vfmadd231ss_fma(ZEXT416((uint)(fVar133 * auVar97._0_4_)),
                                              ZEXT416((uint)fVar148),auVar70);
                    auVar272 = vfmadd231ss_fma(ZEXT416((uint)(auVar74._0_4_ * fVar133)),
                                               ZEXT416((uint)fVar148),auVar272);
                    auVar66 = vfmadd231ss_fma(ZEXT416((uint)(auVar75._0_4_ * fVar133)),
                                              ZEXT416((uint)fVar148),auVar66);
                    auVar65 = vfmadd231ss_fma(ZEXT416((uint)(fVar133 * auVar108._0_4_)),
                                              ZEXT416((uint)fVar148),auVar65);
                    fVar96 = 1.0 - local_218;
                    fVar148 = fVar96 * local_218 * local_218 * 3.0;
                    fVar171 = local_218 * local_218 * local_218;
                    auVar66 = vfmadd231ss_fma(ZEXT416((uint)(fVar171 * auVar65._0_4_)),
                                              ZEXT416((uint)fVar148),auVar66);
                    fVar149 = local_218 * 3.0 * fVar96 * fVar96;
                    auVar272 = vfmadd231ss_fma(auVar66,ZEXT416((uint)fVar149),auVar272);
                    fVar95 = fVar96 * fVar96 * fVar96;
                    auVar70 = vfmadd231ss_fma(auVar272,ZEXT416((uint)fVar95),auVar70);
                    fVar64 = auVar70._0_4_;
                    if (((fVar62 <= fVar64) &&
                        (fVar150 = *(float *)(ray + k * 4 + 0x80), fVar64 <= fVar150)) &&
                       (pGVar4 = (context->scene->geometries).items[uVar55].ptr,
                       (pGVar4->mask & *(uint *)(ray + k * 4 + 0x90)) != 0)) {
                      auVar70 = vshufps_avx(auVar200,auVar200,0x55);
                      auVar218._8_4_ = 0x3f800000;
                      auVar218._0_8_ = &DAT_3f8000003f800000;
                      auVar218._12_4_ = 0x3f800000;
                      auVar272 = vsubps_avx(auVar218,auVar70);
                      fVar151 = auVar70._0_4_;
                      auVar228._0_4_ = fVar151 * (float)local_4a8._0_4_;
                      fVar152 = auVar70._4_4_;
                      auVar228._4_4_ = fVar152 * (float)local_4a8._4_4_;
                      fVar244 = auVar70._8_4_;
                      auVar228._8_4_ = fVar244 * fStack_4a0;
                      fVar254 = auVar70._12_4_;
                      auVar228._12_4_ = fVar254 * fStack_49c;
                      auVar242._0_4_ = fVar151 * (float)local_4e8._0_4_;
                      auVar242._4_4_ = fVar152 * (float)local_4e8._4_4_;
                      auVar242._8_4_ = fVar244 * fStack_4e0;
                      auVar242._12_4_ = fVar254 * fStack_4dc;
                      auVar250._0_4_ = fVar151 * (float)local_4f8._0_4_;
                      auVar250._4_4_ = fVar152 * (float)local_4f8._4_4_;
                      auVar250._8_4_ = fVar244 * fStack_4f0;
                      auVar250._12_4_ = fVar254 * fStack_4ec;
                      auVar264._0_4_ = fVar151 * fVar153;
                      auVar264._4_4_ = fVar152 * fVar170;
                      auVar264._8_4_ = fVar244 * fVar172;
                      auVar264._12_4_ = fVar254 * fVar174;
                      auVar66 = vfmadd231ps_fma(auVar228,auVar272,local_498);
                      auVar65 = vfmadd231ps_fma(auVar242,auVar272,local_4c8);
                      auVar97 = vfmadd231ps_fma(auVar250,auVar272,local_4d8);
                      auVar74 = vfmadd231ps_fma(auVar264,auVar272,local_4b8);
                      auVar272 = vsubps_avx(auVar65,auVar66);
                      auVar66 = vsubps_avx(auVar97,auVar65);
                      auVar65 = vsubps_avx(auVar74,auVar97);
                      auVar265._0_4_ = local_218 * auVar66._0_4_;
                      auVar265._4_4_ = local_218 * auVar66._4_4_;
                      auVar265._8_4_ = local_218 * auVar66._8_4_;
                      auVar265._12_4_ = local_218 * auVar66._12_4_;
                      auVar207._4_4_ = fVar96;
                      auVar207._0_4_ = fVar96;
                      auVar207._8_4_ = fVar96;
                      auVar207._12_4_ = fVar96;
                      auVar272 = vfmadd231ps_fma(auVar265,auVar207,auVar272);
                      auVar229._0_4_ = local_218 * auVar65._0_4_;
                      auVar229._4_4_ = local_218 * auVar65._4_4_;
                      auVar229._8_4_ = local_218 * auVar65._8_4_;
                      auVar229._12_4_ = local_218 * auVar65._12_4_;
                      auVar66 = vfmadd231ps_fma(auVar229,auVar207,auVar66);
                      auVar230._0_4_ = local_218 * auVar66._0_4_;
                      auVar230._4_4_ = local_218 * auVar66._4_4_;
                      auVar230._8_4_ = local_218 * auVar66._8_4_;
                      auVar230._12_4_ = local_218 * auVar66._12_4_;
                      auVar66 = vfmadd231ps_fma(auVar230,auVar207,auVar272);
                      auVar190._0_4_ = fVar171 * (float)local_378._0_4_;
                      auVar190._4_4_ = fVar171 * (float)local_378._4_4_;
                      auVar190._8_4_ = fVar171 * fStack_370;
                      auVar190._12_4_ = fVar171 * fStack_36c;
                      auVar129._4_4_ = fVar148;
                      auVar129._0_4_ = fVar148;
                      auVar129._8_4_ = fVar148;
                      auVar129._12_4_ = fVar148;
                      auVar272 = vfmadd132ps_fma(auVar129,auVar190,local_368);
                      auVar166._4_4_ = fVar149;
                      auVar166._0_4_ = fVar149;
                      auVar166._8_4_ = fVar149;
                      auVar166._12_4_ = fVar149;
                      auVar272 = vfmadd132ps_fma(auVar166,auVar272,local_358);
                      auVar191._0_4_ = auVar66._0_4_ * 3.0;
                      auVar191._4_4_ = auVar66._4_4_ * 3.0;
                      auVar191._8_4_ = auVar66._8_4_ * 3.0;
                      auVar191._12_4_ = auVar66._12_4_ * 3.0;
                      auVar145._4_4_ = fVar95;
                      auVar145._0_4_ = fVar95;
                      auVar145._8_4_ = fVar95;
                      auVar145._12_4_ = fVar95;
                      auVar66 = vfmadd132ps_fma(auVar145,auVar272,local_348);
                      auVar272 = vshufps_avx(auVar191,auVar191,0xc9);
                      auVar130._0_4_ = auVar66._0_4_ * auVar272._0_4_;
                      auVar130._4_4_ = auVar66._4_4_ * auVar272._4_4_;
                      auVar130._8_4_ = auVar66._8_4_ * auVar272._8_4_;
                      auVar130._12_4_ = auVar66._12_4_ * auVar272._12_4_;
                      auVar272 = vshufps_avx(auVar66,auVar66,0xc9);
                      auVar272 = vfmsub231ps_fma(auVar130,auVar191,auVar272);
                      local_228 = auVar272._0_4_;
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x80) = fVar64;
                        uVar63 = vextractps_avx(auVar272,1);
                        *(undefined4 *)(ray + k * 4 + 0xc0) = uVar63;
                        uVar63 = vextractps_avx(auVar272,2);
                        *(undefined4 *)(ray + k * 4 + 0xd0) = uVar63;
                        *(undefined4 *)(ray + k * 4 + 0xe0) = local_228;
                        *(float *)(ray + k * 4 + 0xf0) = local_218;
                        *(float *)(ray + k * 4 + 0x100) = fVar133;
                        *(uint *)(ray + k * 4 + 0x110) = uVar3;
                        *(uint *)(ray + k * 4 + 0x120) = uVar55;
                        *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                      }
                      else {
                        auVar66 = vshufps_avx(auVar272,auVar272,0x55);
                        auVar272 = vshufps_avx(auVar272,auVar272,0xaa);
                        local_248[0] = (RTCHitN)auVar66[0];
                        local_248[1] = (RTCHitN)auVar66[1];
                        local_248[2] = (RTCHitN)auVar66[2];
                        local_248[3] = (RTCHitN)auVar66[3];
                        local_248[4] = (RTCHitN)auVar66[4];
                        local_248[5] = (RTCHitN)auVar66[5];
                        local_248[6] = (RTCHitN)auVar66[6];
                        local_248[7] = (RTCHitN)auVar66[7];
                        local_248[8] = (RTCHitN)auVar66[8];
                        local_248[9] = (RTCHitN)auVar66[9];
                        local_248[10] = (RTCHitN)auVar66[10];
                        local_248[0xb] = (RTCHitN)auVar66[0xb];
                        local_248[0xc] = (RTCHitN)auVar66[0xc];
                        local_248[0xd] = (RTCHitN)auVar66[0xd];
                        local_248[0xe] = (RTCHitN)auVar66[0xe];
                        local_248[0xf] = (RTCHitN)auVar66[0xf];
                        local_238 = auVar272;
                        uStack_224 = local_228;
                        uStack_220 = local_228;
                        uStack_21c = local_228;
                        fStack_214 = local_218;
                        fStack_210 = local_218;
                        fStack_20c = local_218;
                        local_208 = auVar70;
                        local_1f8 = CONCAT44(uStack_3a4,local_3a8);
                        uStack_1f0 = CONCAT44(uStack_39c,uStack_3a0);
                        local_1e8._4_4_ = uStack_394;
                        local_1e8._0_4_ = local_398;
                        local_1e8._8_4_ = uStack_390;
                        local_1e8._12_4_ = uStack_38c;
                        vpcmpeqd_avx2(ZEXT1632(local_1e8),ZEXT1632(local_1e8));
                        uStack_1d4 = context->user->instID[0];
                        local_1d8 = uStack_1d4;
                        uStack_1d0 = uStack_1d4;
                        uStack_1cc = uStack_1d4;
                        uStack_1c8 = context->user->instPrimID[0];
                        uStack_1c4 = uStack_1c8;
                        uStack_1c0 = uStack_1c8;
                        uStack_1bc = uStack_1c8;
                        *(float *)(ray + k * 4 + 0x80) = fVar64;
                        local_548 = *local_530;
                        uStack_540 = local_530[1];
                        local_528.valid = (int *)&local_548;
                        local_528.geometryUserPtr = pGVar4->userPtr;
                        local_528.context = context->user;
                        local_528.hit = local_248;
                        local_528.N = 4;
                        local_528.ray = (RTCRayN *)ray;
                        if (pGVar4->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          local_3d8._0_8_ = context;
                          (*pGVar4->intersectionFilterN)(&local_528);
                          auVar94._8_56_ = extraout_var;
                          auVar94._0_8_ = extraout_XMM1_Qa;
                          auVar272 = auVar94._0_16_;
                          context = (RayQueryContext *)local_3d8._0_8_;
                        }
                        auVar47._8_8_ = uStack_540;
                        auVar47._0_8_ = local_548;
                        if (auVar47 == (undefined1  [16])0x0) {
                          auVar70 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                          auVar272 = vpcmpeqd_avx(auVar272,auVar272);
                          auVar70 = auVar70 ^ auVar272;
                        }
                        else {
                          p_Var7 = context->args->filter;
                          auVar272 = vpcmpeqd_avx(auVar70,auVar70);
                          if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                            (*p_Var7)(&local_528);
                            auVar272 = vpcmpeqd_avx(auVar272,auVar272);
                          }
                          auVar48._8_8_ = uStack_540;
                          auVar48._0_8_ = local_548;
                          auVar66 = vpcmpeqd_avx(auVar48,_DAT_01feba10);
                          auVar70 = auVar66 ^ auVar272;
                          if (auVar48 != (undefined1  [16])0x0) {
                            auVar66 = auVar66 ^ auVar272;
                            auVar272 = vmaskmovps_avx(auVar66,*(undefined1 (*) [16])local_528.hit);
                            *(undefined1 (*) [16])(local_528.ray + 0xc0) = auVar272;
                            auVar272 = vmaskmovps_avx(auVar66,*(undefined1 (*) [16])
                                                               (local_528.hit + 0x10));
                            *(undefined1 (*) [16])(local_528.ray + 0xd0) = auVar272;
                            auVar272 = vmaskmovps_avx(auVar66,*(undefined1 (*) [16])
                                                               (local_528.hit + 0x20));
                            *(undefined1 (*) [16])(local_528.ray + 0xe0) = auVar272;
                            auVar272 = vmaskmovps_avx(auVar66,*(undefined1 (*) [16])
                                                               (local_528.hit + 0x30));
                            *(undefined1 (*) [16])(local_528.ray + 0xf0) = auVar272;
                            auVar272 = vmaskmovps_avx(auVar66,*(undefined1 (*) [16])
                                                               (local_528.hit + 0x40));
                            *(undefined1 (*) [16])(local_528.ray + 0x100) = auVar272;
                            auVar272 = vmaskmovps_avx(auVar66,*(undefined1 (*) [16])
                                                               (local_528.hit + 0x50));
                            *(undefined1 (*) [16])(local_528.ray + 0x110) = auVar272;
                            auVar272 = vmaskmovps_avx(auVar66,*(undefined1 (*) [16])
                                                               (local_528.hit + 0x60));
                            *(undefined1 (*) [16])(local_528.ray + 0x120) = auVar272;
                            auVar272 = vmaskmovps_avx(auVar66,*(undefined1 (*) [16])
                                                               (local_528.hit + 0x70));
                            *(undefined1 (*) [16])(local_528.ray + 0x130) = auVar272;
                            auVar272 = vmaskmovps_avx(auVar66,*(undefined1 (*) [16])
                                                               (local_528.hit + 0x80));
                            *(undefined1 (*) [16])(local_528.ray + 0x140) = auVar272;
                          }
                        }
                        auVar91._8_8_ = 0x100000001;
                        auVar91._0_8_ = 0x100000001;
                        if ((auVar91 & auVar70) == (undefined1  [16])0x0) {
                          *(float *)(ray + k * 4 + 0x80) = fVar150;
                        }
                      }
                    }
                  }
                }
                break;
              }
              lVar58 = lVar58 + -1;
            } while (lVar58 != 0);
          }
          else {
            bVar42 = false;
          }
        }
      }
    } while (bVar42);
    local_338 = vinsertps_avx(auVar8,ZEXT416((uint)fVar147),0x10);
  } while( true );
}

Assistant:

static __forceinline void intersect_hn(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; Vec3fa n0,dn0,n1,dn1; geom->gather_hermite(p0,t0,n0,dn0,p1,t1,n1,dn1,geom->curve(primID));
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,n0,dn0,n1,dn1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }